

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O0

Tensor<3> *
Omega_h::metric_from_hessian<3>(Tensor<3> *__return_storage_ptr__,Tensor<3> hessian,Real eps)

{
  double dVar1;
  Real RVar2;
  Real RVar3;
  Vector<3> *pVVar4;
  long lVar5;
  int iVar6;
  undefined1 *puVar7;
  double *pdVar8;
  double extraout_XMM0_Qa;
  double dVar9;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double dVar10;
  double dVar11;
  double local_4b98;
  double local_4b48;
  double local_4b40;
  double local_4af8;
  double local_4af0;
  undefined1 local_4ab8 [76];
  int local_4a6c;
  double dStack_4a68;
  Int i_31;
  Vector<3> tilde_l;
  int c_denom;
  int c_num;
  Vector<3> l;
  Tensor<3> r;
  undefined1 local_49a0 [8];
  DiagDecomp<3> ed;
  Real eps_local;
  undefined1 local_4928 [72];
  double local_48e0;
  double local_48d8;
  double local_48d0;
  undefined1 local_48c8 [72];
  undefined1 local_4880 [8];
  DiagDecomp<3> decomp;
  double local_47d8;
  Matrix<3,_3> c;
  Real nm;
  double local_4738;
  double local_4730;
  int local_4724;
  double dStack_4720;
  Int i_30;
  int local_4714;
  double *local_4710;
  int local_4704;
  Real *local_4700;
  undefined1 local_46f8 [72];
  int local_46b0;
  int local_46ac;
  Int i;
  Int j;
  Real x;
  undefined1 *local_4698;
  int local_468c;
  undefined1 *local_4688;
  double local_4678;
  double local_4670 [9];
  double local_4628;
  double local_4620;
  double local_4618;
  double local_4610;
  Vector<3> c_1;
  Int j_2;
  undefined1 local_45c8 [8];
  double adStack_45c0 [8];
  undefined1 local_4580 [8];
  Matrix<3,_3> a_5;
  Few<Omega_h::Vector<3>,_2> dev;
  double local_4478;
  Vector<3> v_5;
  double local_4418;
  Vector<3> v_1;
  double dStack_43f8;
  Int i_10;
  Vector<3> l_1;
  Tensor<3> q;
  int iStack_4390;
  Few<int,_3> mults;
  Few<double,_3> roots;
  undefined1 local_4368 [4];
  Int nroots;
  int local_4320;
  Roots<3> roots_obj;
  int local_41ac;
  int local_41a8;
  Int i_29;
  Int j_8;
  int local_417c;
  int local_4178;
  Int i_1;
  Int j_1;
  int local_414c;
  Int i_2;
  double local_4130 [3];
  int local_4114;
  double dStack_4110;
  Int i_3;
  int local_4104;
  double *local_4100;
  int local_40f4;
  double *local_40f0;
  undefined1 local_40e8 [72];
  double local_40a0;
  double local_4098;
  double local_4090;
  undefined1 local_4088 [72];
  double local_4040;
  Few<double,_3> poly;
  double local_3fc8;
  Vector<3> c_11;
  double local_3f68;
  Vector<3> v_4;
  Real c_norm;
  double local_3f00;
  Vector<3> c_10;
  double local_3ed0;
  Real v_norm;
  undefined1 local_3e98 [72];
  undefined1 local_3e50 [72];
  double local_3e08;
  Matrix<3,_3> s;
  double local_3d58 [9];
  int local_3d0c;
  int local_3d08;
  Int j_5;
  Int i_12;
  int local_3cf4;
  double *local_3cf0;
  int local_3ce4;
  double *local_3ce0;
  int local_3cd4;
  double *local_3cd0;
  double local_3cc8 [3];
  int local_3cac;
  double dStack_3ca8;
  Int i_16;
  int local_3c9c;
  double *local_3c98;
  int local_3c8c;
  double *local_3c88;
  undefined1 local_3c80 [72];
  double local_3c38;
  double local_3c30;
  double local_3c28;
  double local_3c20;
  Vector<3> c_13;
  double local_3bc0;
  Vector<3> v_8;
  Real c_norm_1;
  double local_3b58;
  Vector<3> c_12;
  double local_3b28;
  Real v_norm_1;
  undefined1 local_3af0 [72];
  undefined1 local_3aa8 [72];
  double local_3a60;
  Matrix<3,_3> s_1;
  double local_39b0 [9];
  int local_3964;
  int local_3960;
  Int j_6;
  Int i_18;
  int local_394c;
  double *local_3948;
  int local_393c;
  double *local_3938;
  int local_392c;
  double *local_3928;
  double local_3920 [3];
  int local_3904;
  double dStack_3900;
  Int i_22;
  int local_38f4;
  double *local_38f0;
  int local_38e4;
  double *local_38e0;
  undefined1 local_38d8 [72];
  double local_3890;
  double local_3888;
  double local_3880;
  double local_3878;
  Tensor<3> b_3;
  double local_37e8;
  Vector<3> n;
  undefined1 local_3788 [8];
  Tensor<3> s_2;
  undefined1 local_36d8 [72];
  undefined1 local_3690 [72];
  undefined1 local_3648 [72];
  undefined1 local_3600 [24];
  double adStack_35e8 [6];
  undefined1 local_35b8 [8];
  Matrix<3,_3> c_2;
  Real tA;
  undefined1 local_34f0 [72];
  double local_34a8 [9];
  double local_3460;
  double local_3458;
  double local_3450;
  undefined1 local_3448 [72];
  double local_3400;
  Vector<3> c_3;
  Int j_3;
  double local_33c8 [9];
  double local_3380 [4];
  double local_3360;
  double local_3358;
  double local_3350;
  Vector<3> c_5;
  double local_3320;
  Vector<3> c_6;
  Int j_4;
  double local_32a8 [3];
  int local_328c;
  double dStack_3288;
  Int i_6;
  int local_327c;
  double *local_3278;
  int local_326c;
  double *local_3268;
  double local_3260 [3];
  int local_3244;
  double dStack_3240;
  Int i_5;
  int local_3234;
  double *local_3230;
  int local_3224;
  double *local_3220;
  double local_3218 [6];
  int local_31e8;
  int local_31e4;
  Int i_7;
  int local_31d4;
  double *local_31d0;
  int local_31c4;
  double *local_31c0;
  double local_31b8;
  double local_31b0;
  double local_31a8;
  double local_31a0;
  Real z_3;
  Real z_2;
  Real z_1_1;
  Real radius;
  Real theta;
  double cos_theta;
  Real z_23_real;
  Real z_1;
  Real B;
  Real T;
  Real S;
  Real shift;
  Real D;
  Real R;
  Real Q;
  Real q_1;
  Real p;
  Few<int,_3> mults_1;
  Few<double,_3> roots_1;
  double a_2;
  double a_1;
  double a_0;
  double local_2e20 [4];
  double local_2e00 [5];
  int local_2dd4;
  double dStack_2dd0;
  Int i_8;
  Real t_1;
  double *local_2dc0;
  undefined4 local_2db4;
  double *local_2db0;
  int local_2da4;
  double *local_2da0;
  undefined4 local_2d94;
  double *local_2d90;
  double local_2d88 [4];
  double local_2d68 [5];
  int local_2d3c;
  double dStack_2d38;
  Int i_4;
  Real t;
  double *local_2d28;
  undefined4 local_2d1c;
  double *local_2d18;
  int local_2d0c;
  double *local_2d08;
  undefined4 local_2cfc;
  double *local_2cf8;
  undefined1 local_2cf0 [24];
  undefined1 auStack_2cd8 [24];
  undefined1 auStack_2cc0 [32];
  Real i_9;
  Real h;
  Real g;
  Real f;
  Real e;
  Real d;
  Real c_7;
  Real b;
  Real a_3;
  undefined1 *local_2c58;
  undefined4 local_2c4c;
  undefined1 *local_2c48;
  undefined4 local_2c3c;
  undefined1 *local_2c38;
  undefined4 local_2c2c;
  undefined1 *local_2c28;
  undefined4 local_2c1c;
  undefined1 *local_2c18;
  undefined4 local_2c0c;
  undefined1 *local_2c08;
  undefined4 local_2bfc;
  undefined1 *local_2bf8;
  undefined4 local_2bec;
  undefined1 *local_2be8;
  undefined4 local_2bdc;
  undefined1 *local_2bd8;
  undefined4 local_2bcc;
  undefined1 *local_2bc8;
  undefined4 local_2bbc;
  undefined1 *local_2bb8;
  undefined4 local_2bac;
  undefined1 *local_2ba8;
  undefined4 local_2b9c;
  undefined1 *local_2b98;
  undefined4 local_2b8c;
  undefined1 *local_2b88;
  undefined4 local_2b7c;
  undefined1 *local_2b78;
  undefined4 local_2b6c;
  undefined1 *local_2b68;
  undefined4 local_2b5c;
  undefined1 *local_2b58;
  undefined4 local_2b4c;
  undefined1 *local_2b48;
  double local_2b40;
  double local_2b38;
  undefined8 local_2b28;
  undefined8 local_2b20;
  double local_2b18;
  undefined8 local_2b10;
  double local_2b08;
  double c_8;
  int *local_2af0;
  double c_9;
  int *local_2ad8;
  double local_2ad0;
  double local_2ac8;
  double local_2ab8;
  double local_2ab0;
  double local_2aa8;
  double local_2aa0;
  double local_2a98;
  double local_2a90;
  double local_2a88;
  double local_2a80;
  double local_2a78;
  double local_2a70;
  undefined8 local_2a48;
  double local_2a40;
  double local_2a38 [9];
  int local_29ec;
  double dStack_29e8;
  Int i_23;
  int local_29dc;
  double *local_29d8;
  int local_29cc;
  double *local_29c8;
  double local_29c0 [9];
  int local_2974;
  double dStack_2970;
  Int i_17;
  int local_2964;
  double *local_2960;
  int local_2954;
  double *local_2950;
  double local_2948 [9];
  int local_28fc;
  double dStack_28f8;
  Int i_11;
  int local_28ec;
  double *local_28e8;
  int local_28dc;
  double *local_28d8;
  undefined1 local_28d0 [24];
  undefined1 local_28b8 [28];
  undefined4 local_289c;
  undefined1 *local_2898;
  undefined4 local_288c;
  undefined1 *local_2888;
  undefined4 local_287c;
  undefined1 *local_2878;
  undefined4 local_286c;
  undefined1 *local_2868;
  undefined4 local_285c;
  undefined1 *local_2858;
  undefined4 local_284c;
  undefined1 *local_2848;
  undefined4 local_283c;
  undefined1 *local_2838;
  undefined4 local_282c;
  undefined1 *local_2828;
  undefined4 local_281c;
  undefined1 *local_2818;
  undefined4 local_280c;
  undefined1 *local_2808;
  undefined4 local_27fc;
  undefined1 *local_27f8;
  undefined4 local_27ec;
  undefined1 *local_27e8;
  undefined1 local_27e0 [24];
  undefined1 local_27c8 [28];
  undefined4 local_27ac;
  undefined1 *local_27a8;
  undefined4 local_279c;
  undefined1 *local_2798;
  undefined4 local_278c;
  undefined1 *local_2788;
  undefined4 local_277c;
  undefined1 *local_2778;
  undefined4 local_276c;
  undefined1 *local_2768;
  undefined4 local_275c;
  undefined1 *local_2758;
  undefined4 local_274c;
  undefined1 *local_2748;
  undefined4 local_273c;
  undefined1 *local_2738;
  undefined4 local_272c;
  undefined1 *local_2728;
  undefined4 local_271c;
  undefined1 *local_2718;
  undefined4 local_270c;
  undefined1 *local_2708;
  undefined4 local_26fc;
  undefined1 *local_26f8;
  undefined1 local_26f0 [24];
  undefined1 local_26d8 [28];
  undefined4 local_26bc;
  undefined1 *local_26b8;
  undefined4 local_26ac;
  undefined1 *local_26a8;
  undefined4 local_269c;
  undefined1 *local_2698;
  undefined4 local_268c;
  undefined1 *local_2688;
  undefined4 local_267c;
  undefined1 *local_2678;
  undefined4 local_266c;
  undefined1 *local_2668;
  undefined4 local_265c;
  undefined1 *local_2658;
  undefined4 local_264c;
  undefined1 *local_2648;
  undefined4 local_263c;
  undefined1 *local_2638;
  undefined4 local_262c;
  undefined1 *local_2628;
  undefined4 local_261c;
  undefined1 *local_2618;
  undefined4 local_260c;
  undefined1 *local_2608;
  undefined1 local_2600 [24];
  undefined1 local_25e8 [28];
  undefined4 local_25cc;
  undefined1 *local_25c8;
  undefined4 local_25bc;
  undefined1 *local_25b8;
  undefined4 local_25ac;
  undefined1 *local_25a8;
  undefined4 local_259c;
  undefined1 *local_2598;
  undefined4 local_258c;
  undefined1 *local_2588;
  undefined4 local_257c;
  undefined1 *local_2578;
  undefined4 local_256c;
  undefined1 *local_2568;
  undefined4 local_255c;
  undefined1 *local_2558;
  undefined4 local_254c;
  undefined1 *local_2548;
  undefined4 local_253c;
  undefined1 *local_2538;
  undefined4 local_252c;
  undefined1 *local_2528;
  undefined4 local_251c;
  undefined1 *local_2518;
  undefined1 local_2510 [24];
  undefined1 local_24f8 [28];
  undefined4 local_24dc;
  undefined1 *local_24d8;
  undefined4 local_24cc;
  undefined1 *local_24c8;
  undefined4 local_24bc;
  undefined1 *local_24b8;
  undefined4 local_24ac;
  undefined1 *local_24a8;
  undefined4 local_249c;
  undefined1 *local_2498;
  undefined4 local_248c;
  undefined1 *local_2488;
  undefined4 local_247c;
  undefined1 *local_2478;
  undefined4 local_246c;
  undefined1 *local_2468;
  undefined4 local_245c;
  undefined1 *local_2458;
  undefined4 local_244c;
  undefined1 *local_2448;
  undefined4 local_243c;
  undefined1 *local_2438;
  undefined4 local_242c;
  undefined1 *local_2428;
  undefined1 local_2420 [24];
  undefined1 local_2408 [28];
  undefined4 local_23ec;
  undefined1 *local_23e8;
  undefined4 local_23dc;
  undefined1 *local_23d8;
  undefined4 local_23cc;
  undefined1 *local_23c8;
  undefined4 local_23bc;
  undefined1 *local_23b8;
  undefined4 local_23ac;
  undefined1 *local_23a8;
  undefined4 local_239c;
  undefined1 *local_2398;
  undefined4 local_238c;
  undefined1 *local_2388;
  undefined4 local_237c;
  undefined1 *local_2378;
  undefined4 local_236c;
  undefined1 *local_2368;
  undefined4 local_235c;
  undefined1 *local_2358;
  undefined4 local_234c;
  undefined1 *local_2348;
  undefined4 local_233c;
  undefined1 *local_2338;
  double local_2330;
  double local_2328;
  double local_2320;
  double local_2318;
  double local_2310;
  double local_2308;
  double local_2300;
  double local_22f8;
  double local_22f0;
  double local_22e8;
  double local_22e0;
  double local_22d8;
  double local_22d0;
  double local_22c8;
  double local_22c0;
  double local_22b8;
  double local_22b0;
  double local_22a8;
  double local_22a0;
  double local_2298;
  double local_2290;
  double local_2288;
  double local_2280;
  double local_2278;
  double local_2270;
  double local_2268;
  double local_2260;
  double local_2258;
  double local_2250;
  double local_2248;
  double local_2240;
  double local_2238;
  double local_2230;
  double local_2228;
  double local_2220;
  double local_2218;
  double local_2210;
  double local_2208;
  double local_2200;
  undefined4 local_21f4;
  double *local_21f0;
  undefined4 local_21e4;
  double *local_21e0;
  undefined4 local_21d4;
  double *local_21d0;
  double local_21c8;
  double local_21c0;
  double local_21b8;
  undefined4 local_21ac;
  double *local_21a8;
  undefined4 local_219c;
  double *local_2198;
  undefined4 local_218c;
  double *local_2188;
  double local_2180;
  double local_2178;
  double local_2170;
  undefined4 local_2164;
  double *local_2160;
  undefined4 local_2154;
  double *local_2150;
  undefined4 local_2144;
  double *local_2140;
  double local_2138;
  double local_2130;
  double local_2128;
  undefined4 local_211c;
  double *local_2118;
  undefined4 local_210c;
  double *local_2108;
  undefined4 local_20fc;
  double *local_20f8;
  double local_20f0;
  double local_20e8;
  double local_20e0;
  undefined4 local_20d4;
  double *local_20d0;
  undefined4 local_20c4;
  double *local_20c0;
  undefined4 local_20b4;
  double *local_20b0;
  double local_20a8;
  double local_20a0;
  double local_2098;
  undefined4 local_208c;
  double *local_2088;
  undefined4 local_207c;
  double *local_2078;
  undefined4 local_206c;
  double *local_2068;
  double local_2060;
  double local_2058;
  double local_2050;
  double local_2048;
  double local_2040;
  double local_2038;
  double local_2030;
  double local_2028;
  double local_2020;
  double local_2018;
  double local_2010;
  double local_2008;
  double local_2000;
  double local_1ff8;
  double local_1ff0;
  double local_1fe8;
  double local_1fe0;
  double local_1fd8;
  double local_1fd0;
  double local_1fc8;
  double local_1fc0;
  double local_1fb8 [6];
  int local_1f84;
  double dStack_1f80;
  Int i_13;
  double out;
  double *local_1f70;
  int local_1f64;
  double *local_1f60;
  undefined4 local_1f54;
  double *local_1f50;
  undefined4 local_1f44;
  double *local_1f40;
  double local_1f38;
  double local_1f30;
  double local_1f28;
  double local_1f20;
  double local_1f18;
  double local_1f10;
  double local_1f08;
  double local_1f00;
  double local_1ef8;
  double local_1ef0;
  double local_1ee8;
  double local_1ee0;
  double local_1ed8;
  double local_1ed0;
  double local_1ec8;
  double local_1ec0;
  double local_1eb8;
  double local_1eb0;
  double local_1ea8;
  double local_1ea0;
  double local_1e98;
  double local_1e90 [6];
  int local_1e5c;
  double dStack_1e58;
  Int i_14;
  double out_1;
  double *local_1e48;
  int local_1e3c;
  double *local_1e38;
  undefined4 local_1e2c;
  double *local_1e28;
  undefined4 local_1e1c;
  double *local_1e18;
  double local_1e10;
  double local_1e08;
  double local_1e00;
  double local_1df8;
  double local_1df0;
  double local_1de8;
  double local_1de0;
  double local_1dd8;
  double local_1dd0;
  double local_1dc8;
  double local_1dc0;
  double local_1db8;
  double local_1db0;
  double local_1da8;
  double local_1da0;
  double local_1d98;
  double local_1d90;
  double local_1d88;
  double local_1d80;
  double local_1d78;
  double local_1d70;
  double local_1d68 [6];
  int local_1d34;
  double dStack_1d30;
  Int i_15;
  double out_2;
  double *local_1d20;
  int local_1d14;
  double *local_1d10;
  undefined4 local_1d04;
  double *local_1d00;
  undefined4 local_1cf4;
  double *local_1cf0;
  double local_1ce8;
  double local_1ce0;
  double local_1cd8;
  double local_1cd0;
  double local_1cc8;
  double local_1cc0;
  double local_1cb8;
  double local_1cb0;
  double local_1ca8;
  double local_1ca0;
  double local_1c98;
  double local_1c90;
  double local_1c88;
  double local_1c80;
  double local_1c78;
  double local_1c70;
  double local_1c68;
  double local_1c60;
  double local_1c58;
  double local_1c50;
  double local_1c48;
  double local_1c40 [6];
  int local_1c0c;
  double dStack_1c08;
  Int i_19;
  double out_3;
  double *local_1bf8;
  int local_1bec;
  double *local_1be8;
  undefined4 local_1bdc;
  double *local_1bd8;
  undefined4 local_1bcc;
  double *local_1bc8;
  double local_1bc0;
  double local_1bb8;
  double local_1bb0;
  double local_1ba8;
  double local_1ba0;
  double local_1b98;
  double local_1b90;
  double local_1b88;
  double local_1b80;
  double local_1b78;
  double local_1b70;
  double local_1b68;
  double local_1b60;
  double local_1b58;
  double local_1b50;
  double local_1b48;
  double local_1b40;
  double local_1b38;
  double local_1b30;
  double local_1b28;
  double local_1b20;
  double local_1b18 [6];
  int local_1ae4;
  double dStack_1ae0;
  Int i_20;
  double out_4;
  double *local_1ad0;
  int local_1ac4;
  double *local_1ac0;
  undefined4 local_1ab4;
  double *local_1ab0;
  undefined4 local_1aa4;
  double *local_1aa0;
  double local_1a98;
  double local_1a90;
  double local_1a88;
  double local_1a80;
  double local_1a78;
  double local_1a70;
  double local_1a68;
  double local_1a60;
  double local_1a58;
  double local_1a50;
  double local_1a48;
  double local_1a40;
  double local_1a38;
  double local_1a30;
  double local_1a28;
  double local_1a20;
  double local_1a18;
  double local_1a10;
  double local_1a08;
  double local_1a00;
  double local_19f8;
  double local_19f0 [6];
  int local_19bc;
  double dStack_19b8;
  Int i_21;
  double out_5;
  double *local_19a8;
  int local_199c;
  double *local_1998;
  undefined4 local_198c;
  double *local_1988;
  undefined4 local_197c;
  double *local_1978;
  undefined1 local_1970 [72];
  double local_1928;
  double local_1920;
  double local_1918;
  double local_1910;
  double local_1908;
  double local_1900;
  double local_18f8;
  Real row_norm;
  Int i_26;
  double local_18d0;
  Real best_norm;
  undefined1 local_18c0 [4];
  int best_row;
  double adStack_18a8 [6];
  double local_1878;
  Matrix<3,_3> ta;
  double local_1800 [9];
  int local_17b4;
  int local_17b0;
  Int j_7;
  Int i_24;
  int local_179c;
  double *local_1798;
  int local_178c;
  double *local_1788;
  int local_177c;
  double *local_1778;
  double local_1770 [3];
  int local_1754;
  double dStack_1750;
  Int i_28;
  int local_1744;
  double *local_1740;
  int local_1734;
  double *local_1730;
  double local_1728;
  double local_1720;
  double local_1718;
  double local_1710;
  double local_1708;
  double local_1700;
  double local_1620 [6];
  int local_15ec;
  double dStack_15e8;
  Int i_25;
  double out_6;
  double *local_15d8;
  int local_15cc;
  double *local_15c8;
  undefined4 local_15bc;
  double *local_15b8;
  undefined4 local_15ac;
  double *local_15a8;
  double local_15a0;
  double local_1598;
  double local_1590;
  double local_1588;
  double local_1580;
  double local_1578;
  double local_1570;
  double local_1568;
  double local_1560;
  double local_1558;
  double local_1550;
  double local_1548;
  double local_1540;
  double local_1538;
  double local_1530;
  double local_1528;
  double local_1520;
  double local_1518;
  double local_1510;
  double local_1508;
  double local_1500;
  double local_14f8 [6];
  int local_14c4;
  double dStack_14c0;
  Int i_27;
  double out_7;
  double *local_14b0;
  int local_14a4;
  double *local_14a0;
  undefined4 local_1494;
  double *local_1490;
  undefined4 local_1484;
  double *local_1480;
  double local_1478;
  double local_1470;
  double local_1468;
  double local_1460;
  Vector<3> v_10;
  Vector<3> v_9;
  double b_5;
  double a_4;
  double sign;
  double local_1208;
  double dStack_1200;
  double dStack_11f8;
  double local_11f0;
  double local_11e8;
  double local_11e0;
  double local_11d8;
  double local_11d0;
  double local_11c8;
  double local_11c0;
  double local_11b8;
  double local_11b0;
  double local_11a8;
  Matrix<3,_3> c_22;
  double local_1148;
  Tensor<3> a_6;
  undefined1 local_10b8 [8];
  Matrix<3,_3> c_16;
  double local_1028 [9];
  double local_fe0;
  double local_fd8;
  double local_fd0;
  undefined1 local_fc8 [72];
  double local_f80;
  Vector<3> c_24;
  Int j_14;
  double local_f48 [9];
  double local_f00 [4];
  double local_ee0;
  double local_ed8;
  double local_ed0;
  Vector<3> c_26;
  double local_ea0;
  Vector<3> c_27;
  Int j_15;
  double local_e28 [3];
  int local_e0c;
  double dStack_e08;
  Int i_41;
  int local_dfc;
  double *local_df8;
  int local_dec;
  double *local_de8;
  double local_de0 [3];
  int local_dc4;
  double dStack_dc0;
  Int i_40;
  int local_db4;
  double *local_db0;
  int local_da4;
  double *local_da0;
  double local_d98 [6];
  int local_d68;
  int local_d64;
  Int i_42;
  int local_d54;
  double *local_d50;
  int local_d44;
  double *local_d40;
  undefined1 local_d38 [72];
  double local_cf0 [9];
  double local_ca8;
  double local_ca0;
  double local_c98;
  undefined1 local_c90 [72];
  double local_c48;
  Vector<3> c_17;
  Int j_10;
  double local_c10 [9];
  double local_bc8 [4];
  double local_ba8;
  double local_ba0;
  double local_b98;
  Vector<3> c_19;
  double local_b68;
  Vector<3> c_20;
  Int j_11;
  double local_af0 [3];
  int local_ad4;
  double dStack_ad0;
  Int i_35;
  int local_ac4;
  double *local_ac0;
  int local_ab4;
  double *local_ab0;
  double local_aa8 [3];
  int local_a8c;
  double dStack_a88;
  Int i_34;
  int local_a7c;
  double *local_a78;
  int local_a6c;
  double *local_a68;
  double local_a60 [6];
  int local_a30;
  int local_a2c;
  Int i_36;
  int local_a1c;
  double *local_a18;
  int local_a0c;
  double *local_a08;
  double local_a00 [3];
  int local_9e8;
  int local_9e4;
  Int i_33;
  Int j_9;
  Int i_32;
  Int local_9cc;
  double *local_9c8;
  int local_9bc;
  double *local_9b8;
  int local_9ac;
  double *local_9a8;
  int local_99c;
  double *local_998;
  int local_98c;
  double *local_988;
  Int local_97c;
  double *local_978;
  undefined1 local_970 [72];
  undefined1 local_928 [72];
  undefined8 local_8e0;
  Matrix<3,_3> b_7;
  undefined1 local_868 [8];
  Vector<3> v_13;
  undefined1 local_820 [8];
  Vector<3> v_12;
  double local_7d8;
  Vector<3> v_11;
  Tensor<3> b_6;
  undefined8 local_740 [9];
  int local_6f4;
  int local_6f0;
  Int j_12;
  Int i_37;
  int local_6dc;
  undefined8 *local_6d8;
  int local_6cc;
  undefined8 *local_6c8;
  int local_6bc;
  undefined8 *local_6b8;
  double local_6b0 [9];
  double local_668;
  double local_660;
  double local_658;
  double local_650;
  Vector<3> c_23;
  Int j_13;
  double local_608 [3];
  int local_5ec;
  double dStack_5e8;
  Int i_39;
  int local_5dc;
  double *local_5d8;
  int local_5cc;
  double *local_5c8;
  double local_5c0;
  double dStack_5b8;
  double dStack_5b0;
  double dStack_5a8;
  double local_5a0;
  double dStack_598;
  double dStack_590;
  double local_588;
  double dStack_580;
  Real i_38;
  Real h_1;
  Real g_1;
  Real f_1;
  Real e_1;
  Real d_1;
  Real c_21;
  Real b_8;
  Real a_7;
  double *local_528;
  undefined4 local_51c;
  double *local_518;
  undefined4 local_50c;
  double *local_508;
  undefined4 local_4fc;
  double *local_4f8;
  undefined4 local_4ec;
  double *local_4e8;
  undefined4 local_4dc;
  double *local_4d8;
  undefined4 local_4cc;
  double *local_4c8;
  undefined4 local_4bc;
  double *local_4b8;
  undefined4 local_4ac;
  double *local_4a8;
  undefined4 local_49c;
  double *local_498;
  undefined4 local_48c;
  double *local_488;
  undefined4 local_47c;
  double *local_478;
  undefined4 local_46c;
  double *local_468;
  undefined4 local_45c;
  double *local_458;
  undefined4 local_44c;
  double *local_448;
  undefined4 local_43c;
  double *local_438;
  undefined4 local_42c;
  double *local_428;
  undefined4 local_41c;
  double *local_418;
  undefined1 local_410 [24];
  undefined1 local_3f8 [28];
  undefined4 local_3dc;
  undefined1 *local_3d8;
  undefined4 local_3cc;
  undefined1 *local_3c8;
  undefined4 local_3bc;
  undefined1 *local_3b8;
  undefined4 local_3ac;
  undefined1 *local_3a8;
  undefined4 local_39c;
  undefined1 *local_398;
  undefined4 local_38c;
  undefined1 *local_388;
  undefined4 local_37c;
  undefined1 *local_378;
  undefined4 local_36c;
  undefined1 *local_368;
  undefined4 local_35c;
  undefined1 *local_358;
  undefined4 local_34c;
  undefined1 *local_348;
  undefined4 local_33c;
  undefined1 *local_338;
  undefined4 local_32c;
  undefined1 *local_328;
  undefined1 local_320 [24];
  undefined1 local_308 [28];
  undefined4 local_2ec;
  undefined1 *local_2e8;
  undefined4 local_2dc;
  undefined1 *local_2d8;
  undefined4 local_2cc;
  undefined1 *local_2c8;
  undefined4 local_2bc;
  undefined1 *local_2b8;
  undefined4 local_2ac;
  undefined1 *local_2a8;
  undefined4 local_29c;
  undefined1 *local_298;
  undefined4 local_28c;
  undefined1 *local_288;
  undefined4 local_27c;
  undefined1 *local_278;
  undefined4 local_26c;
  undefined1 *local_268;
  undefined4 local_25c;
  undefined1 *local_258;
  undefined4 local_24c;
  undefined1 *local_248;
  undefined4 local_23c;
  undefined1 *local_238;
  undefined1 local_230 [24];
  undefined1 local_218 [28];
  undefined4 local_1fc;
  undefined1 *local_1f8;
  undefined4 local_1ec;
  undefined1 *local_1e8;
  undefined4 local_1dc;
  undefined1 *local_1d8;
  undefined4 local_1cc;
  undefined1 *local_1c8;
  undefined4 local_1bc;
  undefined1 *local_1b8;
  undefined4 local_1ac;
  undefined1 *local_1a8;
  undefined4 local_19c;
  undefined1 *local_198;
  undefined4 local_18c;
  undefined1 *local_188;
  undefined4 local_17c;
  undefined1 *local_178;
  undefined4 local_16c;
  undefined1 *local_168;
  undefined4 local_15c;
  undefined1 *local_158;
  undefined4 local_14c;
  undefined1 *local_148;
  double local_140;
  double local_138;
  double local_130;
  undefined4 local_124;
  double *local_120;
  undefined4 local_114;
  double *local_110;
  undefined4 local_104;
  double *local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  undefined4 local_dc;
  undefined1 *local_d8;
  undefined4 local_cc;
  undefined1 *local_c8;
  undefined4 local_bc;
  undefined1 *local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  undefined4 local_94;
  undefined1 *local_90;
  undefined4 local_84;
  undefined1 *local_80;
  undefined4 local_74;
  undefined1 *local_70;
  undefined4 local_64;
  double *local_60;
  undefined4 local_54;
  double *local_50;
  undefined4 local_44;
  double *local_40;
  undefined4 local_34;
  double *local_30;
  undefined4 local_24;
  double *local_20;
  undefined4 local_14;
  double *local_10;
  
  dVar10 = roots_1.array_[0];
  ed.l.super_Few<double,_3>.array_[2] = eps;
  memcpy(r.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_ + 2,&hessian,0x48)
  ;
  memcpy(local_4928,r.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_ + 2,
         0x48);
  memcpy(c.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_ + 2,local_4928,
         0x48);
  puVar7 = local_46f8;
  memcpy(puVar7,c.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_ + 2,0x48);
  _i = 0.0;
  for (local_46ac = 0; dVar1 = _i, local_46ac < 3; local_46ac = local_46ac + 1) {
    for (local_46b0 = 0; dVar1 = _i, local_46b0 < 3; local_46b0 = local_46b0 + 1) {
      local_4698 = local_46f8;
      x._4_4_ = local_46ac;
      local_4688 = local_4698 + (long)local_46ac * 0x18;
      local_468c = local_46b0;
      std::abs((int)puVar7);
      local_4678 = dVar1;
      local_4af0 = extraout_XMM0_Qa;
      if (extraout_XMM0_Qa <= dVar1) {
        local_4af0 = dVar1;
      }
      _i = local_4af0;
    }
  }
  if (_i <= 1e-10) {
    for (local_4178 = 0; local_4178 < 3; local_4178 = local_4178 + 1) {
      for (local_417c = 0; local_417c < 3; local_417c = local_417c + 1) {
        local_4af8 = 1.0;
        if (local_417c != local_4178) {
          local_4af8 = 0.0;
        }
        ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[(long)local_4178 + -1].super_Few<double,_3>.
        array_[(long)local_417c + 2] = local_4af8;
      }
    }
    for (local_414c = 0; local_414c < 3; local_414c = local_414c + 1) {
      (&ed.l)[-1].super_Few<double,_3>.array_[(long)local_414c + 2] = 0.0;
    }
    goto LAB_0051b07a;
  }
  memcpy(decomp.l.super_Few<double,_3>.array_ + 2,local_4928,0x48);
  memcpy(local_4670,decomp.l.super_Few<double,_3>.array_ + 2,0x48);
  for (c_1.super_Few<double,_3>.array_[2]._4_4_ = 0; c_1.super_Few<double,_3>.array_[2]._4_4_ < 3;
      c_1.super_Few<double,_3>.array_[2]._4_4_ = c_1.super_Few<double,_3>.array_[2]._4_4_ + 1) {
    lVar5 = (long)c_1.super_Few<double,_3>.array_[2]._4_4_;
    local_4628 = local_4670[lVar5 * 3];
    local_4620 = local_4670[lVar5 * 3 + 1];
    local_4618 = local_4670[lVar5 * 3 + 2];
    dStack_4110 = dVar1;
    for (local_4114 = 0; local_4114 < 3; local_4114 = local_4114 + 1) {
      local_40f4 = local_4114;
      local_40f0 = local_4130;
      local_4104 = local_4114;
      local_4100 = &local_4610;
      local_4100[local_4114] = local_40f0[local_4114] / dVar1;
    }
    lVar5 = (long)c_1.super_Few<double,_3>.array_[2]._4_4_;
    c.super_Few<Omega_h::Vector<3>,_3>.array_[lVar5 + -1].super_Few<double,_3>.array_[2] =
         local_4610;
    c.super_Few<Omega_h::Vector<3>,_3>.array_[lVar5].super_Few<double,_3>.array_[0] =
         c_1.super_Few<double,_3>.array_[0];
    c.super_Few<Omega_h::Vector<3>,_3>.array_[lVar5].super_Few<double,_3>.array_[1] =
         c_1.super_Few<double,_3>.array_[1];
    local_4130[0] = local_4628;
    local_4130[1] = local_4620;
    local_4130[2] = local_4618;
  }
  memcpy(local_4928,&local_47d8,0x48);
  memcpy(local_48c8,local_4928,0x48);
  memcpy(local_45c8,local_48c8,0x48);
  memcpy(local_4368,local_45c8,0x48);
  memcpy(local_40e8,local_4368,0x48);
  memcpy(local_4088,local_40e8,0x48);
  memcpy(local_36d8,local_4088,0x48);
  memcpy(c_2.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_ + 2,local_36d8,
         0x48);
  memcpy(local_2d88,c_2.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_ + 2,
         0x48);
  local_2d18 = local_2d88;
  local_2d1c = 0;
  local_2cfc = 0;
  dStack_2d38 = local_2d88[0];
  for (local_2d3c = 1; local_2d3c < 3; local_2d3c = local_2d3c + 1) {
    t._4_4_ = local_2d3c;
    local_2d28 = local_2d88;
    local_2d08 = local_2d28 + (long)local_2d3c * 3;
    local_2d0c = local_2d3c;
    dStack_2d38 = local_2d08[local_2d3c] + dStack_2d38;
  }
  local_2cf8 = local_2d18;
  memcpy(local_3600,local_36d8,0x48);
  memcpy(local_3648,local_36d8,0x48);
  memcpy(local_34a8,local_3648,0x48);
  memcpy(local_34f0,local_3600,0x48);
  for (c_3.super_Few<double,_3>.array_[2]._0_4_ = 0; c_3.super_Few<double,_3>.array_[2]._0_4_ < 3;
      c_3.super_Few<double,_3>.array_[2]._0_4_ = c_3.super_Few<double,_3>.array_[2]._0_4_ + 1) {
    memcpy(local_3448,local_34f0,0x48);
    lVar5 = (long)c_3.super_Few<double,_3>.array_[2]._0_4_;
    local_3460 = local_34a8[lVar5 * 3];
    local_3458 = local_34a8[lVar5 * 3 + 1];
    local_3450 = local_34a8[lVar5 * 3 + 2];
    local_3380[0] = local_3460;
    local_3380[1] = local_3458;
    local_3380[2] = local_3450;
    memcpy(local_33c8,local_3448,0x48);
    for (local_3244 = 0; local_3244 < 3; local_3244 = local_3244 + 1) {
      local_3224 = local_3244;
      local_3220 = local_3260;
      local_3234 = local_3244;
      local_3230 = &local_3400;
      local_3230[local_3244] = local_3220[local_3244] * local_3380[0];
    }
    for (c_6.super_Few<double,_3>.array_[2]._4_4_ = 1; c_6.super_Few<double,_3>.array_[2]._4_4_ < 3;
        c_6.super_Few<double,_3>.array_[2]._4_4_ = c_6.super_Few<double,_3>.array_[2]._4_4_ + 1) {
      lVar5 = (long)c_6.super_Few<double,_3>.array_[2]._4_4_;
      local_3380[3] = local_33c8[lVar5 * 3];
      local_3360 = local_33c8[lVar5 * 3 + 1];
      local_3358 = local_33c8[lVar5 * 3 + 2];
      dStack_3288 = local_3380[c_6.super_Few<double,_3>.array_[2]._4_4_];
      for (local_328c = 0; local_328c < 3; local_328c = local_328c + 1) {
        local_326c = local_328c;
        local_3268 = local_32a8;
        local_327c = local_328c;
        local_3278 = &local_3350;
        local_3278[local_328c] = local_3268[local_328c] * dStack_3288;
      }
      for (local_31e8 = 0; local_31e8 < 3; local_31e8 = local_31e8 + 1) {
        local_31c4 = local_31e8;
        local_31c0 = local_3218;
        local_31d4 = local_31e8;
        local_31d0 = local_3218 + 3;
        local_31e4 = local_31e8;
        _i_7 = &local_3320;
        _i_7[local_31e8] = local_31c0[local_31e8] + local_31d0[local_31e8];
      }
      local_3400 = local_3320;
      c_3.super_Few<double,_3>.array_[0] = c_6.super_Few<double,_3>.array_[0];
      c_3.super_Few<double,_3>.array_[1] = c_6.super_Few<double,_3>.array_[1];
      local_32a8[0] = local_3380[3];
      local_32a8[1] = local_3360;
      local_32a8[2] = local_3358;
    }
    iVar6 = c_3.super_Few<double,_3>.array_[2]._0_4_;
    lVar5 = (long)c_3.super_Few<double,_3>.array_[2]._0_4_;
    (&c_2)[-1].super_Few<Omega_h::Vector<3>,_3>.array_[lVar5 + 2].super_Few<double,_3>.array_[2] =
         local_3400;
    c_2.super_Few<Omega_h::Vector<3>,_3>.array_[lVar5].super_Few<double,_3>.array_[0] =
         c_3.super_Few<double,_3>.array_[0];
    c_2.super_Few<Omega_h::Vector<3>,_3>.array_[lVar5].super_Few<double,_3>.array_[1] =
         c_3.super_Few<double,_3>.array_[1];
    c_3.super_Few<double,_3>.array_[2]._4_4_ = iVar6;
    dStack_3240 = local_3380[0];
  }
  memcpy(local_2e20,local_35b8,0x48);
  local_2db0 = local_2e20;
  local_2db4 = 0;
  local_2d94 = 0;
  dStack_2dd0 = local_2e20[0];
  for (local_2dd4 = 1; local_2dd4 < 3; local_2dd4 = local_2dd4 + 1) {
    t_1._4_4_ = local_2dd4;
    local_2dc0 = local_2e20;
    local_2da0 = local_2dc0 + (long)local_2dd4 * 3;
    local_2da4 = local_2dd4;
    dStack_2dd0 = local_2da0[local_2dd4] + dStack_2dd0;
  }
  local_2d90 = local_2db0;
  memcpy(local_3690,local_36d8,0x48);
  puVar7 = local_2cf0;
  memcpy(puVar7,local_3690,0x48);
  iVar6 = (int)puVar7;
  local_2bd8 = local_2cf0;
  local_2bdc = 0;
  local_2b4c = 0;
  local_2be8 = local_2cf0;
  local_2bec = 1;
  local_2b58 = auStack_2cd8;
  local_2b5c = 0;
  local_2bf8 = local_2cf0;
  local_2bfc = 2;
  local_2b68 = auStack_2cc0;
  local_2b6c = 0;
  local_2c08 = local_2cf0;
  local_2c0c = 0;
  local_2b7c = 1;
  local_2c18 = local_2cf0;
  local_2c1c = 1;
  local_2b88 = auStack_2cd8;
  local_2b8c = 1;
  local_2c28 = local_2cf0;
  local_2c2c = 2;
  local_2b98 = auStack_2cc0;
  local_2b9c = 1;
  local_2c38 = local_2cf0;
  local_2c3c = 0;
  local_2bac = 2;
  local_2c48 = local_2cf0;
  local_2c4c = 1;
  local_2bb8 = auStack_2cd8;
  local_2bbc = 2;
  local_2c58 = local_2cf0;
  a_3._4_4_ = 2;
  local_2bc8 = auStack_2cc0;
  local_2bcc = 2;
  local_40a0 = local_4040;
  local_4098 = poly.array_[0];
  local_4090 = poly.array_[1];
  local_31b8 = local_4040;
  local_31b0 = poly.array_[0];
  local_31a8 = poly.array_[1];
  q_1 = (poly.array_[0] * 3.0 + -(poly.array_[1] * poly.array_[1])) / 3.0;
  dVar11 = poly.array_[1] * poly.array_[1] * poly.array_[1];
  Q = ((poly.array_[0] * 9.0 * poly.array_[1] + -(local_4040 * 27.0)) - (dVar11 + dVar11)) / 27.0;
  R = q_1 / 3.0;
  dVar11 = Q / 2.0;
  shift = R * R * R + dVar11 * dVar11;
  S = -poly.array_[1] / 3.0;
  D = dVar11;
  local_2ba8 = local_2c38;
  local_2b78 = local_2c08;
  local_2b48 = local_2bd8;
  local_2b38 = R;
  local_2ab8 = R;
  local_2a88 = R;
  local_2a80 = R;
  local_2a78 = R;
  local_2a70 = R;
  if (shift < 0.0) {
    local_2b40 = R;
    local_2ab0 = R;
    local_2aa8 = R;
    local_2aa0 = R;
    local_2a98 = R;
    local_2a90 = R;
    dVar9 = sqrt(-(R * R * R));
    theta = dVar11 / dVar9;
    local_2b20 = 0xbff0000000000000;
    local_2b28 = 0x3ff0000000000000;
    local_2b10 = 0xbff0000000000000;
    local_4b40 = theta;
    if (theta < -1.0) {
      local_4b40 = -1.0;
    }
    local_2a40 = local_4b40;
    local_2a48 = 0x3ff0000000000000;
    if (local_4b40 <= 1.0) {
      local_4b48 = local_4b40;
    }
    else {
      local_4b48 = 1.0;
    }
    local_2b18 = theta;
    local_2b08 = theta;
    radius = acos(local_4b48);
    dVar11 = sqrt(-R);
    z_1_1 = dVar11 * 2.0;
    dVar9 = cos(radius / 3.0);
    RVar2 = z_1_1;
    z_2 = dVar11 * 2.0 * dVar9 + S;
    dVar11 = cos((radius + 6.283185307179586) / 3.0);
    RVar3 = z_1_1;
    z_3 = RVar2 * dVar11 + S;
    dVar11 = cos((radius - 6.283185307179586) / 3.0);
    local_31a0 = RVar3 * dVar11 + S;
    roots_1.array_[0] = z_3;
    roots_1.array_[1] = local_31a0;
  }
  else {
    dVar9 = sqrt(shift);
    T = cbrt(dVar11 + dVar9);
    RVar2 = D;
    dVar11 = sqrt(shift);
    B = cbrt(RVar2 - dVar11);
    z_1 = T + B;
    z_23_real = S + z_1;
    cos_theta = z_1 * -0.5 + S;
    roots_1.array_[0] = cos_theta;
    roots_1.array_[1] = cos_theta;
  }
  std::abs(iVar6);
  if (5e-05 <= extraout_XMM0_Qa_00) {
    std::abs(iVar6);
    if (extraout_XMM0_Qa_01 < 5e-05) {
      local_2ad8 = mults_1.array_ + 1;
      c_9 = (double)&roots_1;
      mults_1.array_._4_8_ = roots_1.array_[0];
      goto LAB_005161af;
    }
    std::abs(iVar6);
    if (extraout_XMM0_Qa_02 < 5e-05) goto LAB_005161af;
    local_4320 = 3;
  }
  else {
    local_2af0 = mults_1.array_ + 1;
    c_8 = (double)(roots_1.array_ + 1);
    mults_1.array_._4_8_ = roots_1.array_[1];
LAB_005161af:
    local_2ac8 = roots_1.array_[0];
    local_2ad0 = roots_1.array_[1];
    std::abs(iVar6);
    if (5e-05 <= extraout_XMM0_Qa_03) {
      local_4320 = 2;
    }
    else {
      local_4320 = 1;
    }
  }
  stack0xffffffffffffbc6c = stack0xffffffffffffceec;
  if (local_4320 == 3) {
    for (v_1.super_Few<double,_3>.array_[2]._4_4_ = 0; v_1.super_Few<double,_3>.array_[2]._4_4_ < 3;
        v_1.super_Few<double,_3>.array_[2]._4_4_ = v_1.super_Few<double,_3>.array_[2]._4_4_ + 1) {
      memcpy(v_5.super_Few<double,_3>.array_ + 2,local_45c8,0x48);
      dVar10 = (&roots)[-1].array_[(long)v_1.super_Few<double,_3>.array_[2]._4_4_ + 2];
      memcpy(poly.array_ + 2,v_5.super_Few<double,_3>.array_ + 2,0x48);
      s.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[2] = dVar10;
      memcpy(local_3e98,poly.array_ + 2,0x48);
      dVar10 = s.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[2];
      memcpy(local_2948,local_3e98,0x48);
      dStack_28f8 = dVar10;
      for (local_28fc = 0; local_28fc < 3; local_28fc = local_28fc + 1) {
        local_28ec = local_28fc;
        local_28e8 = local_2948;
        local_28d8 = local_28e8 + (long)local_28fc * 3;
        local_28dc = local_28fc;
        local_28d8[local_28fc] = local_28d8[local_28fc] - dVar10;
      }
      memcpy(local_3e50,local_2948,0x48);
      memcpy(local_3d58,local_3e50,0x48);
      for (local_3d08 = 0; local_3d08 < 3; local_3d08 = local_3d08 + 1) {
        for (local_3d0c = 0; local_3d0c < 3; local_3d0c = local_3d0c + 1) {
          local_3cf4 = local_3d0c;
          local_3cf0 = local_3d58;
          local_3cd0 = local_3cf0 + (long)local_3d0c * 3;
          local_3cd4 = local_3d08;
          j_5 = local_3d08;
          _i_12 = &local_3e08;
          local_3ce0 = _i_12 + (long)local_3d08 * 3;
          local_3ce4 = local_3d0c;
          local_3ce0[local_3d0c] = local_3cd0[local_3d08];
        }
      }
      local_2338 = local_2420;
      local_233c = 1;
      local_2348 = local_2408;
      local_234c = 2;
      local_2358 = local_2420;
      local_235c = 2;
      local_2368 = local_2408;
      local_236c = 1;
      local_2200 = s.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0] *
                   s.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[1] +
                   -(s.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1] *
                    s.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[0]);
      local_2378 = local_2420;
      local_237c = 2;
      local_2388 = local_2408;
      local_238c = 0;
      local_2398 = local_2420;
      local_239c = 0;
      local_23a8 = local_2408;
      local_23ac = 2;
      local_2208 = s.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1] *
                   s.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2] +
                   -(local_3e08 *
                    s.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[1]);
      local_23b8 = local_2420;
      local_23bc = 0;
      local_23c8 = local_2408;
      local_23cc = 1;
      local_23d8 = local_2420;
      local_23dc = 1;
      local_23e8 = local_2408;
      local_23ec = 0;
      local_2210 = local_3e08 *
                   s.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[0] +
                   -(s.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0] *
                    s.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2]);
      local_21d0 = &local_4418;
      local_21d4 = 0;
      local_21e0 = &local_4418;
      local_21e4 = 1;
      local_21f0 = &local_4418;
      local_21f4 = 2;
      c_10.super_Few<double,_3>.array_[2] = local_4418;
      local_2240 = local_4418;
      local_2238 = v_1.super_Few<double,_3>.array_[0];
      local_2230 = v_1.super_Few<double,_3>.array_[1];
      local_2228 = local_4418;
      local_2220 = v_1.super_Few<double,_3>.array_[0];
      local_2218 = v_1.super_Few<double,_3>.array_[1];
      local_2060 = local_4418;
      local_2058 = v_1.super_Few<double,_3>.array_[0];
      local_2050 = v_1.super_Few<double,_3>.array_[1];
      local_2030 = local_4418;
      local_2028 = v_1.super_Few<double,_3>.array_[0];
      local_2020 = v_1.super_Few<double,_3>.array_[1];
      local_2048 = local_4418;
      local_2040 = v_1.super_Few<double,_3>.array_[0];
      local_2038 = v_1.super_Few<double,_3>.array_[1];
      local_2000 = local_4418;
      local_1ff8 = v_1.super_Few<double,_3>.array_[0];
      local_1ff0 = v_1.super_Few<double,_3>.array_[1];
      local_2018 = local_4418;
      local_2010 = v_1.super_Few<double,_3>.array_[0];
      local_2008 = v_1.super_Few<double,_3>.array_[1];
      local_1fd0 = local_4418;
      local_1fc8 = v_1.super_Few<double,_3>.array_[0];
      local_1fc0 = v_1.super_Few<double,_3>.array_[1];
      local_1fe8 = local_4418;
      local_1fe0 = v_1.super_Few<double,_3>.array_[0];
      local_1fd8 = v_1.super_Few<double,_3>.array_[1];
      local_1fb8[3] = local_4418;
      local_1fb8[4] = v_1.super_Few<double,_3>.array_[0];
      local_1fb8[5] = v_1.super_Few<double,_3>.array_[1];
      local_1fb8[0] = local_4418;
      local_1fb8[1] = v_1.super_Few<double,_3>.array_[0];
      local_1fb8[2] = v_1.super_Few<double,_3>.array_[1];
      local_1f40 = local_1fb8;
      local_1f44 = 0;
      local_1f50 = local_1fb8 + 3;
      local_1f54 = 0;
      dStack_1f80 = local_4418 * local_4418;
      for (local_1f84 = 1; local_1f84 < 3; local_1f84 = local_1f84 + 1) {
        local_1f64 = local_1f84;
        local_1f60 = local_1fb8;
        out._4_4_ = local_1f84;
        local_1f70 = local_1fb8 + 3;
        dStack_1f80 = local_1f60[local_1f84] * local_1f70[local_1f84] + dStack_1f80;
      }
      local_3ed0 = sqrt(dStack_1f80);
      local_2428 = local_2510;
      local_242c = 1;
      local_2438 = local_24f8;
      local_243c = 2;
      local_2448 = local_2510;
      local_244c = 2;
      local_2458 = local_24f8;
      local_245c = 1;
      local_21b8 = s.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[0] *
                   s.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[1] +
                   -(s.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[1] *
                    s.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[0]);
      local_2468 = local_2510;
      local_246c = 2;
      local_2478 = local_24f8;
      local_247c = 0;
      local_2488 = local_2510;
      local_248c = 0;
      local_2498 = local_24f8;
      local_249c = 2;
      local_21c0 = s.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[1] *
                   s.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[2] +
                   -(s.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2] *
                    s.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[1]);
      local_24a8 = local_2510;
      local_24ac = 0;
      local_24b8 = local_24f8;
      local_24bc = 1;
      local_24c8 = local_2510;
      local_24cc = 1;
      local_24d8 = local_24f8;
      local_24dc = 0;
      local_21c8 = s.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2] *
                   s.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[0] +
                   -(s.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[0] *
                    s.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[2]);
      local_2188 = &local_3f00;
      local_218c = 0;
      local_2198 = &local_3f00;
      local_219c = 1;
      local_21a8 = &local_3f00;
      local_21ac = 2;
      v_4.super_Few<double,_3>.array_[2] = local_3f00;
      local_2270 = local_3f00;
      local_2268 = c_10.super_Few<double,_3>.array_[0];
      local_2260 = c_10.super_Few<double,_3>.array_[1];
      local_2258 = local_3f00;
      local_2250 = c_10.super_Few<double,_3>.array_[0];
      local_2248 = c_10.super_Few<double,_3>.array_[1];
      local_1f38 = local_3f00;
      local_1f30 = c_10.super_Few<double,_3>.array_[0];
      local_1f28 = c_10.super_Few<double,_3>.array_[1];
      local_1f08 = local_3f00;
      local_1f00 = c_10.super_Few<double,_3>.array_[0];
      local_1ef8 = c_10.super_Few<double,_3>.array_[1];
      local_1f20 = local_3f00;
      local_1f18 = c_10.super_Few<double,_3>.array_[0];
      local_1f10 = c_10.super_Few<double,_3>.array_[1];
      local_1ed8 = local_3f00;
      local_1ed0 = c_10.super_Few<double,_3>.array_[0];
      local_1ec8 = c_10.super_Few<double,_3>.array_[1];
      local_1ef0 = local_3f00;
      local_1ee8 = c_10.super_Few<double,_3>.array_[0];
      local_1ee0 = c_10.super_Few<double,_3>.array_[1];
      local_1ea8 = local_3f00;
      local_1ea0 = c_10.super_Few<double,_3>.array_[0];
      local_1e98 = c_10.super_Few<double,_3>.array_[1];
      local_1ec0 = local_3f00;
      local_1eb8 = c_10.super_Few<double,_3>.array_[0];
      local_1eb0 = c_10.super_Few<double,_3>.array_[1];
      local_1e90[3] = local_3f00;
      local_1e90[4] = c_10.super_Few<double,_3>.array_[0];
      local_1e90[5] = c_10.super_Few<double,_3>.array_[1];
      local_1e90[0] = local_3f00;
      local_1e90[1] = c_10.super_Few<double,_3>.array_[0];
      local_1e90[2] = c_10.super_Few<double,_3>.array_[1];
      local_1e18 = local_1e90;
      local_1e1c = 0;
      local_1e28 = local_1e90 + 3;
      local_1e2c = 0;
      dStack_1e58 = local_3f00 * local_3f00;
      for (local_1e5c = 1; local_1e5c < 3; local_1e5c = local_1e5c + 1) {
        local_1e3c = local_1e5c;
        local_1e38 = local_1e90;
        out_1._4_4_ = local_1e5c;
        local_1e48 = local_1e90 + 3;
        dStack_1e58 = local_1e38[local_1e5c] * local_1e48[local_1e5c] + dStack_1e58;
      }
      dVar10 = sqrt(dStack_1e58);
      if (local_3ed0 < dVar10) {
        local_4418 = local_3f00;
        v_1.super_Few<double,_3>.array_[0] = c_10.super_Few<double,_3>.array_[0];
        v_1.super_Few<double,_3>.array_[1] = c_10.super_Few<double,_3>.array_[1];
        local_3ed0 = dVar10;
      }
      local_2518 = local_2600;
      local_251c = 1;
      local_2528 = local_25e8;
      local_252c = 2;
      local_2538 = local_2600;
      local_253c = 2;
      local_2548 = local_25e8;
      local_254c = 1;
      local_2170 = s.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0] *
                   s.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[1] +
                   -(s.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1] *
                    s.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[0]);
      local_2558 = local_2600;
      local_255c = 2;
      local_2568 = local_25e8;
      local_256c = 0;
      local_2578 = local_2600;
      local_257c = 0;
      local_2588 = local_25e8;
      local_258c = 2;
      local_2178 = s.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1] *
                   s.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[2] +
                   -(local_3e08 *
                    s.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[1]);
      local_2598 = local_2600;
      local_259c = 0;
      local_25a8 = local_25e8;
      local_25ac = 1;
      local_25b8 = local_2600;
      local_25bc = 1;
      local_25c8 = local_25e8;
      local_25cc = 0;
      local_2180 = local_3e08 *
                   s.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[0] +
                   -(s.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0] *
                    s.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[2]);
      local_2140 = &local_3f68;
      local_2144 = 0;
      local_2150 = &local_3f68;
      local_2154 = 1;
      local_2160 = &local_3f68;
      local_2164 = 2;
      local_3f00 = local_3f68;
      c_10.super_Few<double,_3>.array_[0] = v_4.super_Few<double,_3>.array_[0];
      c_10.super_Few<double,_3>.array_[1] = v_4.super_Few<double,_3>.array_[1];
      c_11.super_Few<double,_3>.array_[2] = local_3f68;
      local_22a0 = local_3f68;
      local_2298 = v_4.super_Few<double,_3>.array_[0];
      local_2290 = v_4.super_Few<double,_3>.array_[1];
      local_2288 = local_3f68;
      local_2280 = v_4.super_Few<double,_3>.array_[0];
      local_2278 = v_4.super_Few<double,_3>.array_[1];
      local_1e10 = local_3f68;
      local_1e08 = v_4.super_Few<double,_3>.array_[0];
      local_1e00 = v_4.super_Few<double,_3>.array_[1];
      local_1de0 = local_3f68;
      local_1dd8 = v_4.super_Few<double,_3>.array_[0];
      local_1dd0 = v_4.super_Few<double,_3>.array_[1];
      local_1df8 = local_3f68;
      local_1df0 = v_4.super_Few<double,_3>.array_[0];
      local_1de8 = v_4.super_Few<double,_3>.array_[1];
      local_1db0 = local_3f68;
      local_1da8 = v_4.super_Few<double,_3>.array_[0];
      local_1da0 = v_4.super_Few<double,_3>.array_[1];
      local_1dc8 = local_3f68;
      local_1dc0 = v_4.super_Few<double,_3>.array_[0];
      local_1db8 = v_4.super_Few<double,_3>.array_[1];
      local_1d80 = local_3f68;
      local_1d78 = v_4.super_Few<double,_3>.array_[0];
      local_1d70 = v_4.super_Few<double,_3>.array_[1];
      local_1d98 = local_3f68;
      local_1d90 = v_4.super_Few<double,_3>.array_[0];
      local_1d88 = v_4.super_Few<double,_3>.array_[1];
      local_1d68[3] = local_3f68;
      local_1d68[4] = v_4.super_Few<double,_3>.array_[0];
      local_1d68[5] = v_4.super_Few<double,_3>.array_[1];
      local_1d68[0] = local_3f68;
      local_1d68[1] = v_4.super_Few<double,_3>.array_[0];
      local_1d68[2] = v_4.super_Few<double,_3>.array_[1];
      local_1cf0 = local_1d68;
      local_1cf4 = 0;
      local_1d00 = local_1d68 + 3;
      local_1d04 = 0;
      dStack_1d30 = local_3f68 * local_3f68;
      for (local_1d34 = 1; local_1d34 < 3; local_1d34 = local_1d34 + 1) {
        local_1d14 = local_1d34;
        local_1d10 = local_1d68;
        out_2._4_4_ = local_1d34;
        local_1d20 = local_1d68 + 3;
        dStack_1d30 = local_1d10[local_1d34] * local_1d20[local_1d34] + dStack_1d30;
      }
      dVar10 = sqrt(dStack_1d30);
      if (local_3ed0 < dVar10) {
        local_4418 = local_3f00;
        v_1.super_Few<double,_3>.array_[0] = c_10.super_Few<double,_3>.array_[0];
        v_1.super_Few<double,_3>.array_[1] = c_10.super_Few<double,_3>.array_[1];
        local_3ed0 = dVar10;
      }
      if (local_3ed0 <= 1e-10) {
        fail("assertion %s failed at %s +%d\n","v_norm > EPSILON",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_eigen.hpp"
             ,0xbf);
      }
      dStack_3ca8 = local_3ed0;
      local_3cc8[0] = local_4418;
      local_3cc8[1] = v_1.super_Few<double,_3>.array_[0];
      local_3cc8[2] = v_1.super_Few<double,_3>.array_[1];
      for (local_3cac = 0; local_3cac < 3; local_3cac = local_3cac + 1) {
        local_3c8c = local_3cac;
        local_3c88 = local_3cc8;
        local_3c9c = local_3cac;
        local_3c98 = &local_3fc8;
        local_3c98[local_3cac] = local_3c88[local_3cac] / local_3ed0;
      }
      local_4418 = local_3fc8;
      v_1.super_Few<double,_3>.array_[0] = c_11.super_Few<double,_3>.array_[0];
      v_1.super_Few<double,_3>.array_[1] = c_11.super_Few<double,_3>.array_[1];
      lVar5 = (long)v_1.super_Few<double,_3>.array_[2]._4_4_;
      q.super_Few<Omega_h::Vector<3>,_3>.array_[lVar5 + -1].super_Few<double,_3>.array_[2] =
           local_3fc8;
      q.super_Few<Omega_h::Vector<3>,_3>.array_[lVar5].super_Few<double,_3>.array_[0] =
           c_11.super_Few<double,_3>.array_[0];
      q.super_Few<Omega_h::Vector<3>,_3>.array_[lVar5].super_Few<double,_3>.array_[1] =
           c_11.super_Few<double,_3>.array_[1];
      *(double *)
       ((long)(q.super_Few<Omega_h::Vector<3>,_3>.array_ + -2) + 0x10 +
       (long)v_1.super_Few<double,_3>.array_[2]._4_4_ * 8) =
           (&roots)[-1].array_[(long)v_1.super_Few<double,_3>.array_[2]._4_4_ + 2];
    }
  }
  else if ((local_4320 == 2) &&
          (iStack_4390 = (int)((ulong)stack0xffffffffffffceec >> 0x20), iStack_4390 == 2)) {
    memcpy(dev.array_[1].super_Few<double,_3>.array_ + 2,local_45c8,0x48);
    memcpy(local_3c80,dev.array_[1].super_Few<double,_3>.array_ + 2,0x48);
    s_1.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[2] =
         (double)mults_1.array_._4_8_;
    memcpy(local_3af0,local_3c80,0x48);
    dVar11 = s_1.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[2];
    memcpy(local_29c0,local_3af0,0x48);
    dStack_2970 = dVar11;
    for (local_2974 = 0; local_2974 < 3; local_2974 = local_2974 + 1) {
      local_2964 = local_2974;
      local_2960 = local_29c0;
      local_2950 = local_2960 + (long)local_2974 * 3;
      local_2954 = local_2974;
      local_2950[local_2974] = local_2950[local_2974] - dVar11;
    }
    memcpy(local_3aa8,local_29c0,0x48);
    memcpy(local_39b0,local_3aa8,0x48);
    for (local_3960 = 0; local_3960 < 3; local_3960 = local_3960 + 1) {
      for (local_3964 = 0; local_3964 < 3; local_3964 = local_3964 + 1) {
        local_394c = local_3964;
        local_3948 = local_39b0;
        local_3928 = local_3948 + (long)local_3964 * 3;
        local_392c = local_3960;
        j_6 = local_3960;
        _i_18 = &local_3a60;
        local_3938 = _i_18 + (long)local_3960 * 3;
        local_393c = local_3964;
        local_3938[local_3964] = local_3928[local_3960];
      }
    }
    local_2608 = local_26f0;
    local_260c = 1;
    local_2618 = local_26d8;
    local_261c = 2;
    local_2628 = local_26f0;
    local_262c = 2;
    local_2638 = local_26d8;
    local_263c = 1;
    local_2128 = s_1.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0] *
                 s_1.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[1] +
                 -(s_1.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1] *
                  s_1.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[0]);
    local_2648 = local_26f0;
    local_264c = 2;
    local_2658 = local_26d8;
    local_265c = 0;
    local_2668 = local_26f0;
    local_266c = 0;
    local_2678 = local_26d8;
    local_267c = 2;
    local_2130 = s_1.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1] *
                 s_1.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2] +
                 -(local_3a60 *
                  s_1.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[1]);
    local_2688 = local_26f0;
    local_268c = 0;
    local_2698 = local_26d8;
    local_269c = 1;
    local_26a8 = local_26f0;
    local_26ac = 1;
    local_26b8 = local_26d8;
    local_26bc = 0;
    local_2138 = local_3a60 *
                 s_1.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[0] +
                 -(s_1.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0] *
                  s_1.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2]);
    local_20f8 = &local_4478;
    local_20fc = 0;
    local_2108 = &local_4478;
    local_210c = 1;
    local_2118 = &local_4478;
    local_211c = 2;
    c_12.super_Few<double,_3>.array_[2] = local_4478;
    local_22d0 = local_4478;
    local_22c8 = v_5.super_Few<double,_3>.array_[0];
    local_22c0 = v_5.super_Few<double,_3>.array_[1];
    local_22b8 = local_4478;
    local_22b0 = v_5.super_Few<double,_3>.array_[0];
    local_22a8 = v_5.super_Few<double,_3>.array_[1];
    local_1ce8 = local_4478;
    local_1ce0 = v_5.super_Few<double,_3>.array_[0];
    local_1cd8 = v_5.super_Few<double,_3>.array_[1];
    local_1cb8 = local_4478;
    local_1cb0 = v_5.super_Few<double,_3>.array_[0];
    local_1ca8 = v_5.super_Few<double,_3>.array_[1];
    local_1cd0 = local_4478;
    local_1cc8 = v_5.super_Few<double,_3>.array_[0];
    local_1cc0 = v_5.super_Few<double,_3>.array_[1];
    local_1c88 = local_4478;
    local_1c80 = v_5.super_Few<double,_3>.array_[0];
    local_1c78 = v_5.super_Few<double,_3>.array_[1];
    local_1ca0 = local_4478;
    local_1c98 = v_5.super_Few<double,_3>.array_[0];
    local_1c90 = v_5.super_Few<double,_3>.array_[1];
    local_1c58 = local_4478;
    local_1c50 = v_5.super_Few<double,_3>.array_[0];
    local_1c48 = v_5.super_Few<double,_3>.array_[1];
    local_1c70 = local_4478;
    local_1c68 = v_5.super_Few<double,_3>.array_[0];
    local_1c60 = v_5.super_Few<double,_3>.array_[1];
    local_1c40[3] = local_4478;
    local_1c40[4] = v_5.super_Few<double,_3>.array_[0];
    local_1c40[5] = v_5.super_Few<double,_3>.array_[1];
    local_1c40[0] = local_4478;
    local_1c40[1] = v_5.super_Few<double,_3>.array_[0];
    local_1c40[2] = v_5.super_Few<double,_3>.array_[1];
    local_1bc8 = local_1c40;
    local_1bcc = 0;
    local_1bd8 = local_1c40 + 3;
    local_1bdc = 0;
    dStack_1c08 = local_4478 * local_4478;
    for (local_1c0c = 1; local_1c0c < 3; local_1c0c = local_1c0c + 1) {
      local_1bec = local_1c0c;
      local_1be8 = local_1c40;
      out_3._4_4_ = local_1c0c;
      local_1bf8 = local_1c40 + 3;
      dStack_1c08 = local_1be8[local_1c0c] * local_1bf8[local_1c0c] + dStack_1c08;
    }
    local_3b28 = sqrt(dStack_1c08);
    local_26f8 = local_27e0;
    local_26fc = 1;
    local_2708 = local_27c8;
    local_270c = 2;
    local_2718 = local_27e0;
    local_271c = 2;
    local_2728 = local_27c8;
    local_272c = 1;
    local_20e0 = s_1.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[0] *
                 s_1.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[1] +
                 -(s_1.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[1] *
                  s_1.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[0]);
    local_2738 = local_27e0;
    local_273c = 2;
    local_2748 = local_27c8;
    local_274c = 0;
    local_2758 = local_27e0;
    local_275c = 0;
    local_2768 = local_27c8;
    local_276c = 2;
    local_20e8 = s_1.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[1] *
                 s_1.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[2] +
                 -(s_1.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2] *
                  s_1.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[1]);
    local_2778 = local_27e0;
    local_277c = 0;
    local_2788 = local_27c8;
    local_278c = 1;
    local_2798 = local_27e0;
    local_279c = 1;
    local_27a8 = local_27c8;
    local_27ac = 0;
    local_20f0 = s_1.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2] *
                 s_1.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[0] +
                 -(s_1.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[0] *
                  s_1.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[2]);
    local_20b0 = &local_3b58;
    local_20b4 = 0;
    local_20c0 = &local_3b58;
    local_20c4 = 1;
    local_20d0 = &local_3b58;
    local_20d4 = 2;
    v_8.super_Few<double,_3>.array_[2] = local_3b58;
    local_2300 = local_3b58;
    local_22f8 = c_12.super_Few<double,_3>.array_[0];
    local_22f0 = c_12.super_Few<double,_3>.array_[1];
    local_22e8 = local_3b58;
    local_22e0 = c_12.super_Few<double,_3>.array_[0];
    local_22d8 = c_12.super_Few<double,_3>.array_[1];
    local_1bc0 = local_3b58;
    local_1bb8 = c_12.super_Few<double,_3>.array_[0];
    local_1bb0 = c_12.super_Few<double,_3>.array_[1];
    local_1b90 = local_3b58;
    local_1b88 = c_12.super_Few<double,_3>.array_[0];
    local_1b80 = c_12.super_Few<double,_3>.array_[1];
    local_1ba8 = local_3b58;
    local_1ba0 = c_12.super_Few<double,_3>.array_[0];
    local_1b98 = c_12.super_Few<double,_3>.array_[1];
    local_1b60 = local_3b58;
    local_1b58 = c_12.super_Few<double,_3>.array_[0];
    local_1b50 = c_12.super_Few<double,_3>.array_[1];
    local_1b78 = local_3b58;
    local_1b70 = c_12.super_Few<double,_3>.array_[0];
    local_1b68 = c_12.super_Few<double,_3>.array_[1];
    local_1b30 = local_3b58;
    local_1b28 = c_12.super_Few<double,_3>.array_[0];
    local_1b20 = c_12.super_Few<double,_3>.array_[1];
    local_1b48 = local_3b58;
    local_1b40 = c_12.super_Few<double,_3>.array_[0];
    local_1b38 = c_12.super_Few<double,_3>.array_[1];
    local_1b18[3] = local_3b58;
    local_1b18[4] = c_12.super_Few<double,_3>.array_[0];
    local_1b18[5] = c_12.super_Few<double,_3>.array_[1];
    local_1b18[0] = local_3b58;
    local_1b18[1] = c_12.super_Few<double,_3>.array_[0];
    local_1b18[2] = c_12.super_Few<double,_3>.array_[1];
    local_1aa0 = local_1b18;
    local_1aa4 = 0;
    local_1ab0 = local_1b18 + 3;
    local_1ab4 = 0;
    dStack_1ae0 = local_3b58 * local_3b58;
    for (local_1ae4 = 1; local_1ae4 < 3; local_1ae4 = local_1ae4 + 1) {
      local_1ac4 = local_1ae4;
      local_1ac0 = local_1b18;
      out_4._4_4_ = local_1ae4;
      local_1ad0 = local_1b18 + 3;
      dStack_1ae0 = local_1ac0[local_1ae4] * local_1ad0[local_1ae4] + dStack_1ae0;
    }
    dVar11 = sqrt(dStack_1ae0);
    if (local_3b28 < dVar11) {
      local_4478 = local_3b58;
      v_5.super_Few<double,_3>.array_[0] = c_12.super_Few<double,_3>.array_[0];
      v_5.super_Few<double,_3>.array_[1] = c_12.super_Few<double,_3>.array_[1];
      local_3b28 = dVar11;
    }
    local_27e8 = local_28d0;
    local_27ec = 1;
    local_27f8 = local_28b8;
    local_27fc = 2;
    local_2808 = local_28d0;
    local_280c = 2;
    local_2818 = local_28b8;
    local_281c = 1;
    local_2098 = s_1.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0] *
                 s_1.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[1] +
                 -(s_1.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1] *
                  s_1.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[0]);
    local_2828 = local_28d0;
    local_282c = 2;
    local_2838 = local_28b8;
    local_283c = 0;
    local_2848 = local_28d0;
    local_284c = 0;
    local_2858 = local_28b8;
    local_285c = 2;
    local_20a0 = s_1.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1] *
                 s_1.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[2] +
                 -(local_3a60 *
                  s_1.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[1]);
    local_2868 = local_28d0;
    local_286c = 0;
    local_2878 = local_28b8;
    local_287c = 1;
    local_2888 = local_28d0;
    local_288c = 1;
    local_2898 = local_28b8;
    local_289c = 0;
    local_20a8 = local_3a60 *
                 s_1.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[0] +
                 -(s_1.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0] *
                  s_1.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[2]);
    local_2068 = &local_3bc0;
    local_206c = 0;
    local_2078 = &local_3bc0;
    local_207c = 1;
    local_2088 = &local_3bc0;
    local_208c = 2;
    local_3b58 = local_3bc0;
    c_12.super_Few<double,_3>.array_[0] = v_8.super_Few<double,_3>.array_[0];
    c_12.super_Few<double,_3>.array_[1] = v_8.super_Few<double,_3>.array_[1];
    c_13.super_Few<double,_3>.array_[2] = local_3bc0;
    local_2330 = local_3bc0;
    local_2328 = v_8.super_Few<double,_3>.array_[0];
    local_2320 = v_8.super_Few<double,_3>.array_[1];
    local_2318 = local_3bc0;
    local_2310 = v_8.super_Few<double,_3>.array_[0];
    local_2308 = v_8.super_Few<double,_3>.array_[1];
    local_1a98 = local_3bc0;
    local_1a90 = v_8.super_Few<double,_3>.array_[0];
    local_1a88 = v_8.super_Few<double,_3>.array_[1];
    local_1a68 = local_3bc0;
    local_1a60 = v_8.super_Few<double,_3>.array_[0];
    local_1a58 = v_8.super_Few<double,_3>.array_[1];
    local_1a80 = local_3bc0;
    local_1a78 = v_8.super_Few<double,_3>.array_[0];
    local_1a70 = v_8.super_Few<double,_3>.array_[1];
    local_1a38 = local_3bc0;
    local_1a30 = v_8.super_Few<double,_3>.array_[0];
    local_1a28 = v_8.super_Few<double,_3>.array_[1];
    local_1a50 = local_3bc0;
    local_1a48 = v_8.super_Few<double,_3>.array_[0];
    local_1a40 = v_8.super_Few<double,_3>.array_[1];
    local_1a08 = local_3bc0;
    local_1a00 = v_8.super_Few<double,_3>.array_[0];
    local_19f8 = v_8.super_Few<double,_3>.array_[1];
    local_1a20 = local_3bc0;
    local_1a18 = v_8.super_Few<double,_3>.array_[0];
    local_1a10 = v_8.super_Few<double,_3>.array_[1];
    local_19f0[3] = local_3bc0;
    local_19f0[4] = v_8.super_Few<double,_3>.array_[0];
    local_19f0[5] = v_8.super_Few<double,_3>.array_[1];
    local_19f0[0] = local_3bc0;
    local_19f0[1] = v_8.super_Few<double,_3>.array_[0];
    local_19f0[2] = v_8.super_Few<double,_3>.array_[1];
    local_1978 = local_19f0;
    local_197c = 0;
    local_1988 = local_19f0 + 3;
    local_198c = 0;
    dStack_19b8 = local_3bc0 * local_3bc0;
    for (local_19bc = 1; local_19bc < 3; local_19bc = local_19bc + 1) {
      local_199c = local_19bc;
      local_1998 = local_19f0;
      out_5._4_4_ = local_19bc;
      local_19a8 = local_19f0 + 3;
      dStack_19b8 = local_1998[local_19bc] * local_19a8[local_19bc] + dStack_19b8;
    }
    dVar11 = sqrt(dStack_19b8);
    if (local_3b28 < dVar11) {
      local_4478 = local_3b58;
      v_5.super_Few<double,_3>.array_[0] = c_12.super_Few<double,_3>.array_[0];
      v_5.super_Few<double,_3>.array_[1] = c_12.super_Few<double,_3>.array_[1];
      local_3b28 = dVar11;
    }
    if (local_3b28 <= 1e-10) {
      fail("assertion %s failed at %s +%d\n","v_norm > EPSILON",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_eigen.hpp"
           ,0xbf);
    }
    local_3c38 = local_4478;
    local_3c30 = v_5.super_Few<double,_3>.array_[0];
    local_3c28 = v_5.super_Few<double,_3>.array_[1];
    local_3920[0] = local_4478;
    local_3920[1] = v_5.super_Few<double,_3>.array_[0];
    local_3920[2] = v_5.super_Few<double,_3>.array_[1];
    dStack_3900 = local_3b28;
    for (local_3904 = 0; local_3904 < 3; local_3904 = local_3904 + 1) {
      local_38e4 = local_3904;
      local_38e0 = local_3920;
      local_38f4 = local_3904;
      local_38f0 = &local_3c20;
      local_38f0[local_3904] = local_38e0[local_3904] / local_3b28;
    }
    local_4478 = local_3c20;
    v_5.super_Few<double,_3>.array_[0] = c_13.super_Few<double,_3>.array_[0];
    v_5.super_Few<double,_3>.array_[1] = c_13.super_Few<double,_3>.array_[1];
    l_1.super_Few<double,_3>.array_[2] = local_3c20;
    q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0] =
         c_13.super_Few<double,_3>.array_[0];
    q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1] =
         c_13.super_Few<double,_3>.array_[1];
    memcpy(a_5.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_ + 2,local_45c8
           ,0x48);
    memcpy(local_38d8,a_5.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_ + 2
           ,0x48);
    s_2.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[2] = dVar10;
    memcpy(n.super_Few<double,_3>.array_ + 2,local_38d8,0x48);
    memcpy(local_2a38,n.super_Few<double,_3>.array_ + 2,0x48);
    dStack_29e8 = s_2.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[2];
    for (local_29ec = 0; local_29ec < 3; local_29ec = local_29ec + 1) {
      local_29dc = local_29ec;
      local_29d8 = local_2a38;
      local_29c8 = local_29d8 + (long)local_29ec * 3;
      local_29cc = local_29ec;
      local_29c8[local_29ec] =
           local_29c8[local_29ec] -
           s_2.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[2];
    }
    memcpy(local_3788,local_2a38,0x48);
    memcpy(b_3.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_ + 2,local_3788
           ,0x48);
    memcpy(local_1970,b_3.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_ + 2
           ,0x48);
    memcpy(local_18c0,local_1970,0x48);
    memcpy(local_1800,local_18c0,0x48);
    for (local_17b0 = 0; local_17b0 < 3; local_17b0 = local_17b0 + 1) {
      for (local_17b4 = 0; local_17b4 < 3; local_17b4 = local_17b4 + 1) {
        local_179c = local_17b4;
        local_1798 = local_1800;
        local_1778 = local_1798 + (long)local_17b4 * 3;
        local_177c = local_17b0;
        j_7 = local_17b0;
        _i_24 = &local_1878;
        local_1788 = _i_24 + (long)local_17b0 * 3;
        local_178c = local_17b4;
        local_1788[local_17b4] = local_1778[local_17b0];
      }
    }
    best_norm._4_4_ = 0;
    local_15a8 = local_1620;
    local_15ac = 0;
    local_15b8 = local_1620 + 3;
    local_15bc = 0;
    dStack_15e8 = local_1878 * local_1878;
    for (local_15ec = 1; local_15ec < 3; local_15ec = local_15ec + 1) {
      local_15cc = local_15ec;
      local_15c8 = local_1620;
      out_6._4_4_ = local_15ec;
      local_15d8 = local_1620 + 3;
      dStack_15e8 = local_15c8[local_15ec] * local_15d8[local_15ec] + dStack_15e8;
    }
    local_18d0 = sqrt(dStack_15e8);
    for (row_norm._4_4_ = 1; row_norm._4_4_ < 3; row_norm._4_4_ = row_norm._4_4_ + 1) {
      lVar5 = (long)row_norm._4_4_;
      local_1910 = (&ta)[-1].super_Few<Omega_h::Vector<3>,_3>.array_[lVar5 + 2].super_Few<double,_3>
                   .array_[2];
      local_1908 = ta.super_Few<Omega_h::Vector<3>,_3>.array_[lVar5].super_Few<double,_3>.array_[0];
      local_1900 = ta.super_Few<Omega_h::Vector<3>,_3>.array_[lVar5].super_Few<double,_3>.array_[1];
      local_1480 = local_14f8;
      local_1484 = 0;
      local_1490 = local_14f8 + 3;
      local_1494 = 0;
      dStack_14c0 = local_1910 * local_1910;
      for (local_14c4 = 1; local_14c4 < 3; local_14c4 = local_14c4 + 1) {
        local_14a4 = local_14c4;
        local_14a0 = local_14f8;
        out_7._4_4_ = local_14c4;
        local_14b0 = local_14f8 + 3;
        dStack_14c0 = local_14a0[local_14c4] * local_14b0[local_14c4] + dStack_14c0;
      }
      local_1728 = local_1910;
      local_1720 = local_1908;
      local_1718 = local_1900;
      local_1710 = local_1910;
      local_1708 = local_1908;
      local_1700 = local_1900;
      local_15a0 = local_1910;
      local_1598 = local_1908;
      local_1590 = local_1900;
      local_1588 = local_1910;
      local_1580 = local_1908;
      local_1578 = local_1900;
      local_1570 = local_1910;
      local_1568 = local_1908;
      local_1560 = local_1900;
      local_1558 = local_1910;
      local_1550 = local_1908;
      local_1548 = local_1900;
      local_1540 = local_1910;
      local_1538 = local_1908;
      local_1530 = local_1900;
      local_1528 = local_1910;
      local_1520 = local_1908;
      local_1518 = local_1900;
      local_1510 = local_1910;
      local_1508 = local_1908;
      local_1500 = local_1900;
      local_14f8[0] = local_1910;
      local_14f8[1] = local_1908;
      local_14f8[2] = local_1900;
      local_14f8[3] = local_1910;
      local_14f8[4] = local_1908;
      local_14f8[5] = local_1900;
      local_18f8 = sqrt(dStack_14c0);
      if (local_18d0 < local_18f8) {
        best_norm._4_4_ = row_norm._4_4_;
        local_18d0 = local_18f8;
      }
    }
    if (local_18d0 <= 1e-10) {
      fail("assertion %s failed at %s +%d\n","best_norm > EPSILON",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_eigen.hpp"
           ,0xd3);
    }
    ta.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[2]._4_4_ =
         best_norm._4_4_;
    lVar5 = (long)best_norm._4_4_;
    local_1928 = (&ta)[-1].super_Few<Omega_h::Vector<3>,_3>.array_[lVar5 + 2].super_Few<double,_3>.
                 array_[2];
    local_1920 = ta.super_Few<Omega_h::Vector<3>,_3>.array_[lVar5].super_Few<double,_3>.array_[0];
    local_1918 = ta.super_Few<Omega_h::Vector<3>,_3>.array_[lVar5].super_Few<double,_3>.array_[1];
    dStack_1750 = local_18d0;
    for (local_1754 = 0; local_1754 < 3; local_1754 = local_1754 + 1) {
      local_1734 = local_1754;
      local_1730 = local_1770;
      local_1744 = local_1754;
      local_1740 = &local_37e8;
      local_1740[local_1754] = local_1730[local_1754] / local_18d0;
    }
    local_3890 = local_37e8;
    local_3888 = n.super_Few<double,_3>.array_[0];
    local_3880 = n.super_Few<double,_3>.array_[1];
    local_1478 = local_37e8;
    local_1470 = n.super_Few<double,_3>.array_[0];
    local_1468 = n.super_Few<double,_3>.array_[1];
    local_3878 = local_37e8;
    b_3.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[0] =
         n.super_Few<double,_3>.array_[0];
    b_3.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[1] =
         n.super_Few<double,_3>.array_[1];
    b_3.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2] =
         v_10.super_Few<double,_3>.array_[2];
    b_3.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[2] = local_1460;
    b_3.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[0] =
         v_10.super_Few<double,_3>.array_[0];
    b_3.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[1] =
         v_10.super_Few<double,_3>.array_[1];
    dev.array_[0].super_Few<double,_3>.array_[2] = local_1460;
    dev.array_[1].super_Few<double,_3>.array_[0] = v_10.super_Few<double,_3>.array_[0];
    dev.array_[1].super_Few<double,_3>.array_[1] = v_10.super_Few<double,_3>.array_[1];
    q.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_[2] =
         v_10.super_Few<double,_3>.array_[2];
    roots_obj._44_4_ = 2;
    q.super_Few<Omega_h::Vector<3>,_3>.array_[1].super_Few<double,_3>.array_[2] = local_1460;
    q.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[0] =
         v_10.super_Few<double,_3>.array_[0];
    q.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[1] =
         v_10.super_Few<double,_3>.array_[1];
    local_1770[0] = local_1928;
    local_1770[1] = local_1920;
    local_1770[2] = local_1918;
  }
  else {
    if ((local_4320 != 1) ||
       (q.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[2]._4_4_ =
             (int)stack0xffffffffffffceec,
       q.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[2]._4_4_ != 3)) {
      fail("assertion %s failed at %s +%d\n","nroots == 1 && mults[0] == 3",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_eigen.hpp"
           ,0xff);
    }
    for (local_41a8 = 0; local_41a8 < 3; local_41a8 = local_41a8 + 1) {
      for (local_41ac = 0; local_41ac < 3; local_41ac = local_41ac + 1) {
        local_4b98 = 1.0;
        if (local_41ac != local_41a8) {
          local_4b98 = 0.0;
        }
        (&a_5)[-1].super_Few<Omega_h::Vector<3>,_3>.array_[(long)local_41a8 + 2].
        super_Few<double,_3>.array_[(long)local_41ac + 2] = local_4b98;
      }
    }
    memcpy(l_1.super_Few<double,_3>.array_ + 2,local_4580,0x48);
  }
  memcpy(local_4880,l_1.super_Few<double,_3>.array_ + 2,0x48);
  decomp.q.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[2] = dStack_43f8;
  decomp.l.super_Few<double,_3>.array_[0] = l_1.super_Few<double,_3>.array_[0];
  decomp.l.super_Few<double,_3>.array_[1] = l_1.super_Few<double,_3>.array_[1];
  memcpy(local_49a0,local_4880,0x48);
  pdVar8 = ed.q.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_ + 2;
  local_48e0 = decomp.q.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[2];
  local_48d8 = decomp.l.super_Few<double,_3>.array_[0];
  local_48d0 = decomp.l.super_Few<double,_3>.array_[1];
  nm = decomp.q.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[2];
  local_4738 = decomp.l.super_Few<double,_3>.array_[0];
  local_4730 = decomp.l.super_Few<double,_3>.array_[1];
  dStack_4720 = dVar1;
  for (local_4724 = 0; local_4724 < 3; local_4724 = local_4724 + 1) {
    local_4704 = local_4724;
    local_4700 = &nm;
    local_4714 = local_4724;
    pdVar8[local_4724] = local_4700[local_4724] * dVar1;
    local_4710 = pdVar8;
  }
LAB_0051b07a:
  pdVar8 = l.super_Few<double,_3>.array_ + 2;
  memcpy(pdVar8,local_49a0,0x48);
  l.super_Few<double,_3>.array_[0] = ed.l.super_Few<double,_3>.array_[0];
  l.super_Few<double,_3>.array_[1] = ed.l.super_Few<double,_3>.array_[1];
  tilde_l.super_Few<double,_3>.array_[2]._4_4_ = 9;
  tilde_l.super_Few<double,_3>.array_[2]._0_4_ = 0x20;
  for (local_4a6c = 0; local_4a6c < 3; local_4a6c = local_4a6c + 1) {
    std::abs((int)pdVar8);
    *(double *)((long)&stack0xffffffffffffb598 + (long)local_4a6c * 8) =
         (extraout_XMM0_Qa_04 * 9.0) / (ed.l.super_Few<double,_3>.array_[2] * 32.0);
  }
  memcpy(local_4ab8,l.super_Few<double,_3>.array_ + 2,0x48);
  local_11c0 = dStack_4a68;
  local_11b8 = tilde_l.super_Few<double,_3>.array_[0];
  local_11b0 = tilde_l.super_Few<double,_3>.array_[1];
  memcpy(&local_1208,local_4ab8,0x48);
  memcpy(a_6.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_ + 2,&local_1208,
         0x48);
  c_22.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_[2] = local_11c0;
  local_a00[0] = local_11c0;
  local_a00[1] = local_11b8;
  local_a00[2] = local_11b0;
  for (i_33 = 0; iVar6 = i_33, i_33 < 3; i_33 = i_33 + 1) {
    while (local_9e4 = iVar6 + 1, local_9e4 < 3) {
      local_9bc = local_9e4;
      local_9b8 = &local_1148;
      local_978 = local_9b8 + (long)local_9e4 * 3;
      local_97c = i_33;
      local_978[i_33] = 0.0;
      local_9cc = i_33;
      local_9c8 = &local_1148;
      local_988 = local_9c8 + (long)i_33 * 3;
      local_98c = local_9e4;
      local_988[local_9e4] = 0.0;
      iVar6 = local_9e4;
    }
  }
  for (local_9e8 = 0; local_9e8 < 3; local_9e8 = local_9e8 + 1) {
    local_99c = local_9e8;
    local_998 = local_a00;
    j_9 = local_9e8;
    _i_32 = &local_1148;
    local_9a8 = _i_32 + (long)local_9e8 * 3;
    local_9ac = local_9e8;
    local_9a8[local_9e8] = local_998[local_9e8];
  }
  memcpy(local_cf0,&local_1148,0x48);
  memcpy(local_d38,a_6.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_ + 2,
         0x48);
  for (c_17.super_Few<double,_3>.array_[2]._0_4_ = 0; c_17.super_Few<double,_3>.array_[2]._0_4_ < 3;
      c_17.super_Few<double,_3>.array_[2]._0_4_ = c_17.super_Few<double,_3>.array_[2]._0_4_ + 1) {
    memcpy(local_c90,local_d38,0x48);
    lVar5 = (long)c_17.super_Few<double,_3>.array_[2]._0_4_;
    local_ca8 = local_cf0[lVar5 * 3];
    local_ca0 = local_cf0[lVar5 * 3 + 1];
    local_c98 = local_cf0[lVar5 * 3 + 2];
    local_bc8[0] = local_ca8;
    local_bc8[1] = local_ca0;
    local_bc8[2] = local_c98;
    memcpy(local_c10,local_c90,0x48);
    for (local_a8c = 0; local_a8c < 3; local_a8c = local_a8c + 1) {
      local_a6c = local_a8c;
      local_a68 = local_aa8;
      local_a7c = local_a8c;
      local_a78 = &local_c48;
      local_a78[local_a8c] = local_a68[local_a8c] * local_bc8[0];
    }
    for (c_20.super_Few<double,_3>.array_[2]._4_4_ = 1;
        c_20.super_Few<double,_3>.array_[2]._4_4_ < 3;
        c_20.super_Few<double,_3>.array_[2]._4_4_ = c_20.super_Few<double,_3>.array_[2]._4_4_ + 1) {
      lVar5 = (long)c_20.super_Few<double,_3>.array_[2]._4_4_;
      local_bc8[3] = local_c10[lVar5 * 3];
      local_ba8 = local_c10[lVar5 * 3 + 1];
      local_ba0 = local_c10[lVar5 * 3 + 2];
      dStack_ad0 = local_bc8[c_20.super_Few<double,_3>.array_[2]._4_4_];
      for (local_ad4 = 0; local_ad4 < 3; local_ad4 = local_ad4 + 1) {
        local_ab4 = local_ad4;
        local_ab0 = local_af0;
        local_ac4 = local_ad4;
        local_ac0 = &local_b98;
        local_ac0[local_ad4] = local_ab0[local_ad4] * dStack_ad0;
      }
      for (local_a30 = 0; local_a30 < 3; local_a30 = local_a30 + 1) {
        local_a0c = local_a30;
        local_a08 = local_a60;
        local_a1c = local_a30;
        local_a18 = local_a60 + 3;
        local_a2c = local_a30;
        _i_36 = &local_b68;
        _i_36[local_a30] = local_a08[local_a30] + local_a18[local_a30];
      }
      local_c48 = local_b68;
      c_17.super_Few<double,_3>.array_[0] = c_20.super_Few<double,_3>.array_[0];
      c_17.super_Few<double,_3>.array_[1] = c_20.super_Few<double,_3>.array_[1];
      local_af0[0] = local_bc8[3];
      local_af0[1] = local_ba8;
      local_af0[2] = local_ba0;
    }
    iVar6 = c_17.super_Few<double,_3>.array_[2]._0_4_;
    lVar5 = (long)c_17.super_Few<double,_3>.array_[2]._0_4_;
    c_16.super_Few<Omega_h::Vector<3>,_3>.array_[lVar5 + -1].super_Few<double,_3>.array_[2] =
         local_c48;
    c_16.super_Few<Omega_h::Vector<3>,_3>.array_[lVar5].super_Few<double,_3>.array_[0] =
         c_17.super_Few<double,_3>.array_[0];
    c_16.super_Few<Omega_h::Vector<3>,_3>.array_[lVar5].super_Few<double,_3>.array_[1] =
         c_17.super_Few<double,_3>.array_[1];
    c_17.super_Few<double,_3>.array_[2]._4_4_ = iVar6;
    dStack_a88 = local_bc8[0];
  }
  local_14 = 1;
  local_24 = 2;
  local_148 = local_230;
  local_14c = 1;
  local_158 = local_218;
  local_15c = 2;
  local_168 = local_230;
  local_16c = 2;
  local_178 = local_218;
  local_17c = 1;
  local_130 = local_11e8 * local_11c8 + -(local_11e0 * local_11d0);
  local_188 = local_230;
  local_18c = 2;
  local_198 = local_218;
  local_19c = 0;
  local_1a8 = local_230;
  local_1ac = 0;
  local_1b8 = local_218;
  local_1bc = 2;
  local_138 = local_11e0 * local_11d8 + -(local_11f0 * local_11c8);
  local_1c8 = local_230;
  local_1cc = 0;
  local_1d8 = local_218;
  local_1dc = 1;
  local_1e8 = local_230;
  local_1ec = 1;
  local_1f8 = local_218;
  local_1fc = 0;
  local_140 = local_11f0 * local_11d0 + -(local_11e8 * local_11d8);
  local_100 = &local_7d8;
  local_104 = 0;
  local_110 = &local_7d8;
  local_114 = 1;
  local_120 = &local_7d8;
  local_124 = 2;
  v_11.super_Few<double,_3>.array_[2] = local_7d8;
  local_34 = 2;
  local_44 = 0;
  local_238 = local_320;
  local_23c = 1;
  local_248 = local_308;
  local_24c = 2;
  local_258 = local_320;
  local_25c = 2;
  local_268 = local_308;
  local_26c = 1;
  local_e8 = local_11d0 * dStack_11f8 + -(local_11c8 * dStack_1200);
  local_278 = local_320;
  local_27c = 2;
  local_288 = local_308;
  local_28c = 0;
  local_298 = local_320;
  local_29c = 0;
  local_2a8 = local_308;
  local_2ac = 2;
  local_f0 = local_11c8 * local_1208 + -(local_11d8 * dStack_11f8);
  local_2b8 = local_320;
  local_2bc = 0;
  local_2c8 = local_308;
  local_2cc = 1;
  local_2d8 = local_320;
  local_2dc = 1;
  local_2e8 = local_308;
  local_2ec = 0;
  local_f8 = local_11d8 * dStack_1200 + -(local_11d0 * local_1208);
  local_b8 = local_820;
  local_bc = 0;
  local_c8 = local_820;
  local_cc = 1;
  local_d8 = local_820;
  local_dc = 2;
  local_54 = 0;
  local_64 = 1;
  local_328 = local_410;
  local_32c = 1;
  local_338 = local_3f8;
  local_33c = 2;
  local_348 = local_410;
  local_34c = 2;
  local_358 = local_3f8;
  local_35c = 1;
  local_a0 = dStack_1200 * local_11e0 + -(dStack_11f8 * local_11e8);
  local_368 = local_410;
  local_36c = 2;
  local_378 = local_3f8;
  local_37c = 0;
  local_388 = local_410;
  local_38c = 0;
  local_398 = local_3f8;
  local_39c = 2;
  local_a8 = dStack_11f8 * local_11f0 + -(local_1208 * local_11e0);
  local_3a8 = local_410;
  local_3ac = 0;
  local_3b8 = local_3f8;
  local_3bc = 1;
  local_3c8 = local_410;
  local_3cc = 1;
  local_3d8 = local_3f8;
  local_3dc = 0;
  local_b0 = local_1208 * local_11e8 + -(dStack_1200 * local_11f0);
  local_70 = local_868;
  local_74 = 0;
  local_80 = local_868;
  local_84 = 1;
  local_90 = local_868;
  local_94 = 2;
  local_60 = &local_1208;
  local_50 = &local_1208;
  local_40 = &local_1208;
  local_30 = &local_1208;
  local_20 = &local_1208;
  local_10 = &local_1208;
  memcpy(local_928,v_11.super_Few<double,_3>.array_ + 2,0x48);
  memcpy(local_740,local_928,0x48);
  for (local_6f0 = 0; local_6f0 < 3; local_6f0 = local_6f0 + 1) {
    for (local_6f4 = 0; local_6f4 < 3; local_6f4 = local_6f4 + 1) {
      local_6dc = local_6f4;
      local_6d8 = local_740;
      local_6b8 = local_6d8 + (long)local_6f4 * 3;
      local_6bc = local_6f0;
      j_12 = local_6f0;
      _i_37 = &local_8e0;
      local_6c8 = _i_37 + (long)local_6f0 * 3;
      local_6cc = local_6f4;
      local_6c8[local_6f4] = local_6b8[local_6f0];
    }
  }
  memcpy(local_970,&local_1208,0x48);
  memcpy(&local_5c0,local_970,0x48);
  local_4a8 = &local_5c0;
  local_4ac = 0;
  local_41c = 0;
  local_4b8 = &local_5c0;
  local_4bc = 1;
  local_428 = &dStack_5a8;
  local_42c = 0;
  local_4c8 = &local_5c0;
  local_4cc = 2;
  local_438 = &dStack_590;
  local_43c = 0;
  local_4d8 = &local_5c0;
  local_4dc = 0;
  local_44c = 1;
  local_4e8 = &local_5c0;
  local_4ec = 1;
  local_458 = &dStack_5a8;
  local_45c = 1;
  local_4f8 = &local_5c0;
  local_4fc = 2;
  local_468 = &dStack_590;
  local_46c = 1;
  local_508 = &local_5c0;
  local_50c = 0;
  local_47c = 2;
  local_518 = &local_5c0;
  local_51c = 1;
  local_488 = &dStack_5a8;
  local_48c = 2;
  local_528 = &local_5c0;
  a_7._4_4_ = 2;
  local_498 = &dStack_590;
  local_49c = 2;
  dVar10 = -(local_5c0 * local_588) * dStack_598 +
           -(dStack_5a8 * dStack_5b8) * dStack_580 +
           -(dStack_590 * local_5a0) * dStack_5b0 +
           dStack_590 * dStack_5b8 * dStack_598 +
           local_5c0 * local_5a0 * dStack_580 + dStack_5a8 * local_588 * dStack_5b0;
  local_478 = local_508;
  local_448 = local_4d8;
  local_418 = local_4a8;
  memcpy(local_6b0,&local_8e0,0x48);
  for (c_23.super_Few<double,_3>.array_[2]._4_4_ = 0; c_23.super_Few<double,_3>.array_[2]._4_4_ < 3;
      c_23.super_Few<double,_3>.array_[2]._4_4_ = c_23.super_Few<double,_3>.array_[2]._4_4_ + 1) {
    lVar5 = (long)c_23.super_Few<double,_3>.array_[2]._4_4_;
    local_668 = local_6b0[lVar5 * 3];
    local_660 = local_6b0[lVar5 * 3 + 1];
    local_658 = local_6b0[lVar5 * 3 + 2];
    for (local_5ec = 0; local_5ec < 3; local_5ec = local_5ec + 1) {
      local_5cc = local_5ec;
      local_5c8 = local_608;
      local_5dc = local_5ec;
      local_5d8 = &local_650;
      local_5d8[local_5ec] = local_5c8[local_5ec] / dVar10;
    }
    lVar5 = (long)c_23.super_Few<double,_3>.array_[2]._4_4_;
    c_22.super_Few<Omega_h::Vector<3>,_3>.array_[lVar5 + -1].super_Few<double,_3>.array_[2] =
         local_650;
    c_22.super_Few<Omega_h::Vector<3>,_3>.array_[lVar5].super_Few<double,_3>.array_[0] =
         c_23.super_Few<double,_3>.array_[0];
    c_22.super_Few<Omega_h::Vector<3>,_3>.array_[lVar5].super_Few<double,_3>.array_[1] =
         c_23.super_Few<double,_3>.array_[1];
    local_608[0] = local_668;
    local_608[1] = local_660;
    local_608[2] = local_658;
    dStack_5e8 = dVar10;
  }
  memcpy(local_1028,&local_11a8,0x48);
  memcpy(c_16.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_ + 2,local_10b8,
         0x48);
  for (c_24.super_Few<double,_3>.array_[2]._0_4_ = 0; c_24.super_Few<double,_3>.array_[2]._0_4_ < 3;
      c_24.super_Few<double,_3>.array_[2]._0_4_ = c_24.super_Few<double,_3>.array_[2]._0_4_ + 1) {
    memcpy(local_fc8,c_16.super_Few<Omega_h::Vector<3>,_3>.array_[2].super_Few<double,_3>.array_ + 2
           ,0x48);
    lVar5 = (long)c_24.super_Few<double,_3>.array_[2]._0_4_;
    local_fe0 = local_1028[lVar5 * 3];
    local_fd8 = local_1028[lVar5 * 3 + 1];
    local_fd0 = local_1028[lVar5 * 3 + 2];
    local_f00[0] = local_fe0;
    local_f00[1] = local_fd8;
    local_f00[2] = local_fd0;
    memcpy(local_f48,local_fc8,0x48);
    dStack_dc0 = local_f00[0];
    for (local_dc4 = 0; local_dc4 < 3; local_dc4 = local_dc4 + 1) {
      local_da4 = local_dc4;
      local_da0 = local_de0;
      local_db4 = local_dc4;
      local_db0 = &local_f80;
      local_db0[local_dc4] = local_da0[local_dc4] * local_f00[0];
    }
    for (c_27.super_Few<double,_3>.array_[2]._4_4_ = 1;
        c_27.super_Few<double,_3>.array_[2]._4_4_ < 3;
        c_27.super_Few<double,_3>.array_[2]._4_4_ = c_27.super_Few<double,_3>.array_[2]._4_4_ + 1) {
      lVar5 = (long)c_27.super_Few<double,_3>.array_[2]._4_4_;
      local_f00[3] = local_f48[lVar5 * 3];
      local_ee0 = local_f48[lVar5 * 3 + 1];
      local_ed8 = local_f48[lVar5 * 3 + 2];
      dStack_e08 = local_f00[c_27.super_Few<double,_3>.array_[2]._4_4_];
      for (local_e0c = 0; local_e0c < 3; local_e0c = local_e0c + 1) {
        local_dec = local_e0c;
        local_de8 = local_e28;
        local_dfc = local_e0c;
        local_df8 = &local_ed0;
        local_df8[local_e0c] = local_de8[local_e0c] * dStack_e08;
      }
      for (local_d68 = 0; local_d68 < 3; local_d68 = local_d68 + 1) {
        local_d44 = local_d68;
        local_d40 = local_d98;
        local_d54 = local_d68;
        local_d50 = local_d98 + 3;
        local_d64 = local_d68;
        _i_42 = &local_ea0;
        _i_42[local_d68] = local_d40[local_d68] + local_d50[local_d68];
      }
      local_f80 = local_ea0;
      c_24.super_Few<double,_3>.array_[0] = c_27.super_Few<double,_3>.array_[0];
      c_24.super_Few<double,_3>.array_[1] = c_27.super_Few<double,_3>.array_[1];
      local_e28[0] = local_f00[3];
      local_e28[1] = local_ee0;
      local_e28[2] = local_ed8;
    }
    c_24.super_Few<double,_3>.array_[2]._4_4_ = c_24.super_Few<double,_3>.array_[2]._0_4_;
    pVVar4 = (__return_storage_ptr__->super_Few<Omega_h::Vector<3>,_3>).array_ +
             c_24.super_Few<double,_3>.array_[2]._0_4_;
    (pVVar4->super_Few<double,_3>).array_[0] = local_f80;
    (pVVar4->super_Few<double,_3>).array_[1] = c_24.super_Few<double,_3>.array_[0];
    (pVVar4->super_Few<double,_3>).array_[2] = c_24.super_Few<double,_3>.array_[1];
  }
  return __return_storage_ptr__;
}

Assistant:

static OMEGA_H_INLINE_BIG Tensor<dim> metric_from_hessian(
    Tensor<dim> const hessian, Real const eps) {
  auto const ed = decompose_eigen(hessian);
  auto const r = ed.q;
  auto const l = ed.l;
  constexpr auto c_num = square(dim);
  constexpr auto c_denom = 2 * square(dim + 1);
  decltype(ed.l) tilde_l;
  for (Int i = 0; i < dim; ++i) {
    tilde_l[i] = (c_num * std::abs(l[i])) / (c_denom * eps);
  }
  return compose_eigen(r, tilde_l);
}